

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O0

void av1_highbd_convolve_y_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  short sVar32;
  undefined8 uVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  undefined8 uVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ushort uVar52;
  int iVar53;
  ushort uVar57;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  ushort uVar60;
  int iVar61;
  ushort uVar63;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar54 [16];
  ushort uVar56;
  ushort uVar59;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  int iVar58;
  undefined8 extraout_XMM0_Qa_06;
  ushort uVar62;
  ushort uVar65;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  int iVar64;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 auVar55 [16];
  long in_stack_00000008;
  __m128i res_16bit1_1;
  __m128i res_16bit0_1;
  __m128i res_b_round1_1;
  __m128i res_b1_1;
  __m128i res_b_round0_1;
  __m128i res_b0_1;
  __m128i res_a_round1_1;
  __m128i res_a1_1;
  __m128i res_a_round0_1;
  __m128i res_a0_1;
  __m128i s8_1;
  __m128i s7_1;
  __m128i s6_1;
  __m128i s5_1;
  __m128i s4_1;
  __m128i s3_1;
  __m128i s2_1;
  __m128i s1_1;
  __m128i s0_1;
  uint16_t *data_1;
  __m128i coeffs_y_1 [4];
  __m128i s_1 [16];
  __m128i res_16bit1;
  __m128i res_16bit0;
  __m128i res_b_round1;
  __m128i res_b1;
  __m128i res_b_round0;
  __m128i res_b0;
  __m128i res_a_round1;
  __m128i res_a1;
  __m128i res_a_round0;
  __m128i res_a0;
  __m128i s12;
  __m128i s11;
  __m128i s10;
  __m128i s9;
  __m128i s8;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  uint16_t *data;
  __m128i coeffs_y [6];
  __m128i s [24];
  __m128i zero;
  __m128i clip_pixel;
  __m128i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  uint16_t *src_ptr;
  int fo_vert;
  int j;
  int i;
  __m128i *in_stack_ffffffffffffeb68;
  undefined2 local_148c;
  undefined1 in_stack_ffffffffffffeb78 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_stack_ffffffffffffeb88 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  longlong local_1348 [8];
  longlong local_1308;
  undefined8 uStack_1300;
  longlong local_12f8;
  undefined8 uStack_12f0;
  longlong local_12e8;
  undefined8 uStack_12e0;
  undefined2 local_12d8;
  undefined2 uStack_12d6;
  undefined2 uStack_12d4;
  undefined2 uStack_12d2;
  undefined2 uStack_12d0;
  undefined2 uStack_12ce;
  undefined2 uStack_12cc;
  undefined2 uStack_12ca;
  longlong local_12c8;
  undefined8 uStack_12c0;
  longlong local_12b8;
  undefined8 uStack_12b0;
  longlong local_12a8;
  undefined8 uStack_12a0;
  undefined2 local_1298;
  undefined2 uStack_1296;
  undefined2 uStack_1294;
  undefined2 uStack_1292;
  undefined2 uStack_1290;
  undefined2 uStack_128e;
  undefined2 uStack_128c;
  undefined2 uStack_128a;
  longlong local_1288;
  undefined8 uStack_1280;
  longlong local_1278;
  undefined8 uStack_1270;
  longlong local_1268;
  undefined8 uStack_1260;
  undefined2 local_1258;
  undefined2 uStack_1256;
  undefined2 uStack_1254;
  undefined2 uStack_1252;
  undefined2 uStack_1250;
  undefined2 uStack_124e;
  undefined2 uStack_124c;
  undefined2 uStack_124a;
  longlong local_1248;
  undefined8 uStack_1240;
  longlong local_1238;
  undefined8 uStack_1230;
  longlong local_1228;
  undefined8 uStack_1220;
  undefined2 local_1218;
  undefined2 uStack_1216;
  undefined2 uStack_1214;
  undefined2 uStack_1212;
  undefined2 uStack_1210;
  undefined2 uStack_120e;
  undefined2 uStack_120c;
  undefined2 uStack_120a;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  int local_11e8;
  int iStack_11e4;
  int iStack_11e0;
  int iStack_11dc;
  int local_11c8;
  int iStack_11c4;
  int iStack_11c0;
  int iStack_11bc;
  undefined1 local_11a8 [16];
  undefined1 local_1188 [16];
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  long local_1090;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined2 local_fd8;
  undefined2 uStack_fd6;
  undefined2 uStack_fd4;
  undefined2 uStack_fd2;
  undefined2 uStack_fd0;
  undefined2 uStack_fce;
  undefined2 uStack_fcc;
  undefined2 uStack_fca;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined2 local_f78;
  undefined2 uStack_f76;
  undefined2 uStack_f74;
  undefined2 uStack_f72;
  undefined2 uStack_f70;
  undefined2 uStack_f6e;
  undefined2 uStack_f6c;
  undefined2 uStack_f6a;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined2 local_f18;
  undefined2 uStack_f16;
  undefined2 uStack_f14;
  undefined2 uStack_f12;
  undefined2 uStack_f10;
  undefined2 uStack_f0e;
  undefined2 uStack_f0c;
  undefined2 uStack_f0a;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined2 local_eb8;
  undefined2 uStack_eb6;
  undefined2 uStack_eb4;
  undefined2 uStack_eb2;
  undefined2 uStack_eb0;
  undefined2 uStack_eae;
  undefined2 uStack_eac;
  undefined2 uStack_eaa;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined4 local_e64;
  long local_e60;
  int local_e58;
  int local_e54;
  int local_e50;
  int local_e4c;
  int local_e48;
  int local_e44;
  long local_e40;
  int local_e34;
  undefined1 local_e28 [16];
  undefined4 local_e14;
  undefined4 local_e10;
  undefined2 local_e0a;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 *local_df8;
  undefined8 *local_df0;
  undefined8 *local_de8;
  undefined8 *local_de0;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  undefined8 *local_dc0;
  undefined8 *local_db8;
  undefined8 *local_db0;
  undefined8 *local_da8;
  undefined8 *local_da0;
  undefined8 *local_d98;
  undefined8 *local_d90;
  undefined8 *local_d88;
  undefined8 *local_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  undefined8 *local_d68;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  int local_838;
  int iStack_834;
  int iStack_830;
  int iStack_82c;
  undefined8 local_828;
  undefined8 uStack_820;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  undefined8 local_808;
  undefined8 uStack_800;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  int local_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_798;
  int iStack_794;
  int iStack_790;
  int iStack_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  int local_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  int local_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  undefined8 local_668;
  undefined8 uStack_660;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_e58 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
  local_e60 = in_RDI + (long)(local_e58 * in_ESI) * -2;
  local_e64 = 7;
  local_e14 = 7;
  local_e28 = ZEXT416(7);
  local_e78 = local_e28._0_8_;
  uStack_e70 = 0;
  local_e10 = 0x40;
  local_2c = 0x40;
  local_30 = 0x40;
  local_34 = 0x40;
  local_38 = 0x40;
  local_e88 = 0x4000000040;
  uStack_e80 = 0x4000000040;
  if ((int)res_16bit1_1[1] == 10) {
    local_148c = 0x3ff;
  }
  else {
    local_148c = 0xff;
    if ((int)res_16bit1_1[1] == 0xc) {
      local_148c = 0xfff;
    }
  }
  local_e0a = local_148c;
  local_e98 = CONCAT26(local_148c,CONCAT24(local_148c,CONCAT22(local_148c,local_148c)));
  uStack_e90 = CONCAT26(local_148c,CONCAT24(local_148c,CONCAT22(local_148c,local_148c)));
  local_e08 = 0;
  uStack_e00 = 0;
  local_ea8 = 0;
  uStack_ea0 = 0;
  local_e4c = in_R9D;
  local_e48 = in_R8D;
  local_e44 = in_ECX;
  local_e40 = in_RDX;
  local_e34 = in_ESI;
  local_48 = local_e88;
  uStack_40 = uStack_e80;
  local_28 = local_e98;
  uStack_20 = uStack_e90;
  local_10 = local_e0a;
  local_e = local_e0a;
  local_c = local_e0a;
  local_a = local_e0a;
  local_8 = local_e0a;
  local_6 = local_e0a;
  local_4 = local_e0a;
  local_2 = local_e0a;
  if (*(short *)(in_stack_00000008 + 8) == 0xc) {
    prepare_coeffs_12tap
              (in_stack_ffffffffffffeb88._8_8_,in_stack_ffffffffffffeb88._4_4_,
               in_stack_ffffffffffffeb78._8_8_);
    for (local_e54 = 0; local_e54 < local_e48; local_e54 = local_e54 + 8) {
      local_d50 = (undefined8 *)(local_e60 + (long)local_e54 * 2);
      local_10a8 = *local_d50;
      uStack_10a0 = local_d50[1];
      local_d58 = (undefined8 *)((long)local_d50 + (long)local_e34 * 2);
      local_10b8 = *local_d58;
      uStack_10b0 = local_d58[1];
      local_d60 = (undefined8 *)((long)local_d50 + (long)(local_e34 * 2) * 2);
      local_10c8 = *local_d60;
      uStack_10c0 = local_d60[1];
      local_d68 = (undefined8 *)((long)local_d50 + (long)(local_e34 * 3) * 2);
      local_10d8 = *local_d68;
      uStack_10d0 = local_d68[1];
      local_d70 = (undefined8 *)((long)local_d50 + (long)(local_e34 << 2) * 2);
      local_10e8 = *local_d70;
      uStack_10e0 = local_d70[1];
      local_d78 = (undefined8 *)((long)local_d50 + (long)(local_e34 * 5) * 2);
      local_10f8 = *local_d78;
      uStack_10f0 = local_d78[1];
      local_d80 = (undefined8 *)((long)local_d50 + (long)(local_e34 * 6) * 2);
      local_1108 = *local_d80;
      uStack_1100 = local_d80[1];
      local_d88 = (undefined8 *)((long)local_d50 + (long)(local_e34 * 7) * 2);
      local_1118 = *local_d88;
      uStack_1110 = local_d88[1];
      local_d90 = (undefined8 *)((long)local_d50 + (long)(local_e34 << 3) * 2);
      local_1128 = *local_d90;
      uStack_1120 = local_d90[1];
      local_d98 = (undefined8 *)((long)local_d50 + (long)(local_e34 * 9) * 2);
      local_1138 = *local_d98;
      uStack_1130 = local_d98[1];
      local_da0 = (undefined8 *)((long)local_d50 + (long)(local_e34 * 10) * 2);
      local_1148 = *local_da0;
      uStack_1140 = local_da0[1];
      local_ad8._2_2_ = (undefined2)((ulong)local_10a8 >> 0x10);
      local_ad8._4_2_ = (undefined2)((ulong)local_10a8 >> 0x20);
      local_ad8._6_2_ = (undefined2)((ulong)local_10a8 >> 0x30);
      local_ae8._0_2_ = (undefined2)local_10b8;
      local_ae8._2_2_ = (undefined2)((ulong)local_10b8 >> 0x10);
      local_ae8._4_2_ = (undefined2)((ulong)local_10b8 >> 0x20);
      local_ae8._6_2_ = (undefined2)((ulong)local_10b8 >> 0x30);
      local_1028 = CONCAT26(local_ae8._2_2_,
                            CONCAT24(local_ad8._2_2_,
                                     CONCAT22((undefined2)local_ae8,(short)local_10a8)));
      uStack_1020 = CONCAT26(local_ae8._6_2_,
                             CONCAT24(local_ad8._6_2_,CONCAT22(local_ae8._4_2_,local_ad8._4_2_)));
      local_af8._2_2_ = (undefined2)((ulong)local_10c8 >> 0x10);
      local_af8._4_2_ = (undefined2)((ulong)local_10c8 >> 0x20);
      local_af8._6_2_ = (undefined2)((ulong)local_10c8 >> 0x30);
      local_b08._0_2_ = (undefined2)local_10d8;
      local_b08._2_2_ = (undefined2)((ulong)local_10d8 >> 0x10);
      local_b08._4_2_ = (undefined2)((ulong)local_10d8 >> 0x20);
      local_b08._6_2_ = (undefined2)((ulong)local_10d8 >> 0x30);
      local_1018 = CONCAT26(local_b08._2_2_,
                            CONCAT24(local_af8._2_2_,
                                     CONCAT22((undefined2)local_b08,(short)local_10c8)));
      uStack_1010 = CONCAT26(local_b08._6_2_,
                             CONCAT24(local_af8._6_2_,CONCAT22(local_b08._4_2_,local_af8._4_2_)));
      local_b18._2_2_ = (undefined2)((ulong)local_10e8 >> 0x10);
      local_b18._4_2_ = (undefined2)((ulong)local_10e8 >> 0x20);
      local_b18._6_2_ = (undefined2)((ulong)local_10e8 >> 0x30);
      local_b28._0_2_ = (undefined2)local_10f8;
      local_b28._2_2_ = (undefined2)((ulong)local_10f8 >> 0x10);
      local_b28._4_2_ = (undefined2)((ulong)local_10f8 >> 0x20);
      local_b28._6_2_ = (undefined2)((ulong)local_10f8 >> 0x30);
      local_1008 = CONCAT26(local_b28._2_2_,
                            CONCAT24(local_b18._2_2_,
                                     CONCAT22((undefined2)local_b28,(short)local_10e8)));
      uStack_1000 = CONCAT26(local_b28._6_2_,
                             CONCAT24(local_b18._6_2_,CONCAT22(local_b28._4_2_,local_b18._4_2_)));
      local_b38._2_2_ = (undefined2)((ulong)local_1108 >> 0x10);
      local_b38._4_2_ = (undefined2)((ulong)local_1108 >> 0x20);
      local_b38._6_2_ = (undefined2)((ulong)local_1108 >> 0x30);
      local_b48._0_2_ = (undefined2)local_1118;
      local_b48._2_2_ = (undefined2)((ulong)local_1118 >> 0x10);
      local_b48._4_2_ = (undefined2)((ulong)local_1118 >> 0x20);
      local_b48._6_2_ = (undefined2)((ulong)local_1118 >> 0x30);
      local_ff8 = CONCAT26(local_b48._2_2_,
                           CONCAT24(local_b38._2_2_,
                                    CONCAT22((undefined2)local_b48,(short)local_1108)));
      uStack_ff0 = CONCAT26(local_b48._6_2_,
                            CONCAT24(local_b38._6_2_,CONCAT22(local_b48._4_2_,local_b38._4_2_)));
      local_b58._2_2_ = (undefined2)((ulong)local_1128 >> 0x10);
      local_b58._4_2_ = (undefined2)((ulong)local_1128 >> 0x20);
      local_b58._6_2_ = (undefined2)((ulong)local_1128 >> 0x30);
      local_b68._0_2_ = (undefined2)local_1138;
      local_b68._2_2_ = (undefined2)((ulong)local_1138 >> 0x10);
      local_b68._4_2_ = (undefined2)((ulong)local_1138 >> 0x20);
      local_b68._6_2_ = (undefined2)((ulong)local_1138 >> 0x30);
      local_fe8 = CONCAT26(local_b68._2_2_,
                           CONCAT24(local_b58._2_2_,
                                    CONCAT22((undefined2)local_b68,(short)local_1128)));
      uStack_fe0 = CONCAT26(local_b68._6_2_,
                            CONCAT24(local_b58._6_2_,CONCAT22(local_b68._4_2_,local_b58._4_2_)));
      uStack_850._2_2_ = (undefined2)((ulong)uStack_10a0 >> 0x10);
      uStack_850._4_2_ = (undefined2)((ulong)uStack_10a0 >> 0x20);
      uStack_850._6_2_ = (undefined2)((ulong)uStack_10a0 >> 0x30);
      uStack_860._0_2_ = (undefined2)uStack_10b0;
      uStack_860._2_2_ = (undefined2)((ulong)uStack_10b0 >> 0x10);
      uStack_860._4_2_ = (undefined2)((ulong)uStack_10b0 >> 0x20);
      uStack_860._6_2_ = (undefined2)((ulong)uStack_10b0 >> 0x30);
      local_fc8 = CONCAT26(uStack_860._2_2_,
                           CONCAT24(uStack_850._2_2_,
                                    CONCAT22((undefined2)uStack_860,(short)uStack_10a0)));
      uStack_fc0 = CONCAT26(uStack_860._6_2_,
                            CONCAT24(uStack_850._6_2_,CONCAT22(uStack_860._4_2_,uStack_850._4_2_)));
      uStack_870._2_2_ = (undefined2)((ulong)uStack_10c0 >> 0x10);
      uStack_870._4_2_ = (undefined2)((ulong)uStack_10c0 >> 0x20);
      uStack_870._6_2_ = (undefined2)((ulong)uStack_10c0 >> 0x30);
      uStack_880._0_2_ = (undefined2)uStack_10d0;
      uStack_880._2_2_ = (undefined2)((ulong)uStack_10d0 >> 0x10);
      uStack_880._4_2_ = (undefined2)((ulong)uStack_10d0 >> 0x20);
      uStack_880._6_2_ = (undefined2)((ulong)uStack_10d0 >> 0x30);
      local_fb8 = CONCAT26(uStack_880._2_2_,
                           CONCAT24(uStack_870._2_2_,
                                    CONCAT22((undefined2)uStack_880,(short)uStack_10c0)));
      uStack_fb0 = CONCAT26(uStack_880._6_2_,
                            CONCAT24(uStack_870._6_2_,CONCAT22(uStack_880._4_2_,uStack_870._4_2_)));
      uStack_890._2_2_ = (undefined2)((ulong)uStack_10e0 >> 0x10);
      uStack_890._4_2_ = (undefined2)((ulong)uStack_10e0 >> 0x20);
      uStack_890._6_2_ = (undefined2)((ulong)uStack_10e0 >> 0x30);
      uStack_8a0._0_2_ = (undefined2)uStack_10f0;
      uStack_8a0._2_2_ = (undefined2)((ulong)uStack_10f0 >> 0x10);
      uStack_8a0._4_2_ = (undefined2)((ulong)uStack_10f0 >> 0x20);
      uStack_8a0._6_2_ = (undefined2)((ulong)uStack_10f0 >> 0x30);
      local_fa8 = CONCAT26(uStack_8a0._2_2_,
                           CONCAT24(uStack_890._2_2_,
                                    CONCAT22((undefined2)uStack_8a0,(short)uStack_10e0)));
      uStack_fa0 = CONCAT26(uStack_8a0._6_2_,
                            CONCAT24(uStack_890._6_2_,CONCAT22(uStack_8a0._4_2_,uStack_890._4_2_)));
      uStack_8b0._2_2_ = (undefined2)((ulong)uStack_1100 >> 0x10);
      uStack_8b0._4_2_ = (undefined2)((ulong)uStack_1100 >> 0x20);
      uStack_8b0._6_2_ = (undefined2)((ulong)uStack_1100 >> 0x30);
      uStack_8c0._0_2_ = (undefined2)uStack_1110;
      uStack_8c0._2_2_ = (undefined2)((ulong)uStack_1110 >> 0x10);
      uStack_8c0._4_2_ = (undefined2)((ulong)uStack_1110 >> 0x20);
      uStack_8c0._6_2_ = (undefined2)((ulong)uStack_1110 >> 0x30);
      local_f98 = CONCAT26(uStack_8c0._2_2_,
                           CONCAT24(uStack_8b0._2_2_,
                                    CONCAT22((undefined2)uStack_8c0,(short)uStack_1100)));
      uStack_f90 = CONCAT26(uStack_8c0._6_2_,
                            CONCAT24(uStack_8b0._6_2_,CONCAT22(uStack_8c0._4_2_,uStack_8b0._4_2_)));
      uStack_8d0._2_2_ = (undefined2)((ulong)uStack_1120 >> 0x10);
      uStack_8d0._4_2_ = (undefined2)((ulong)uStack_1120 >> 0x20);
      uStack_8d0._6_2_ = (undefined2)((ulong)uStack_1120 >> 0x30);
      uStack_8e0._0_2_ = (undefined2)uStack_1130;
      uStack_8e0._2_2_ = (undefined2)((ulong)uStack_1130 >> 0x10);
      uStack_8e0._4_2_ = (undefined2)((ulong)uStack_1130 >> 0x20);
      uStack_8e0._6_2_ = (undefined2)((ulong)uStack_1130 >> 0x30);
      local_f88 = CONCAT26(uStack_8e0._2_2_,
                           CONCAT24(uStack_8d0._2_2_,
                                    CONCAT22((undefined2)uStack_8e0,(short)uStack_1120)));
      uStack_f80 = CONCAT26(uStack_8e0._6_2_,
                            CONCAT24(uStack_8d0._6_2_,CONCAT22(uStack_8e0._4_2_,uStack_8d0._4_2_)));
      local_f68 = CONCAT26(local_af8._2_2_,
                           CONCAT24(local_ae8._2_2_,
                                    CONCAT22((short)local_10c8,(undefined2)local_ae8)));
      uStack_f60 = CONCAT26(local_af8._6_2_,
                            CONCAT24(local_ae8._6_2_,CONCAT22(local_af8._4_2_,local_ae8._4_2_)));
      local_f58 = CONCAT26(local_b18._2_2_,
                           CONCAT24(local_b08._2_2_,
                                    CONCAT22((short)local_10e8,(undefined2)local_b08)));
      uStack_f50 = CONCAT26(local_b18._6_2_,
                            CONCAT24(local_b08._6_2_,CONCAT22(local_b18._4_2_,local_b08._4_2_)));
      local_f48 = CONCAT26(local_b38._2_2_,
                           CONCAT24(local_b28._2_2_,
                                    CONCAT22((short)local_1108,(undefined2)local_b28)));
      uStack_f40 = CONCAT26(local_b38._6_2_,
                            CONCAT24(local_b28._6_2_,CONCAT22(local_b38._4_2_,local_b28._4_2_)));
      local_f38 = CONCAT26(local_b58._2_2_,
                           CONCAT24(local_b48._2_2_,
                                    CONCAT22((short)local_1128,(undefined2)local_b48)));
      uStack_f30 = CONCAT26(local_b58._6_2_,
                            CONCAT24(local_b48._6_2_,CONCAT22(local_b58._4_2_,local_b48._4_2_)));
      local_c08._0_2_ = (undefined2)local_1148;
      local_c08._2_2_ = (undefined2)((ulong)local_1148 >> 0x10);
      local_c08._4_2_ = (undefined2)((ulong)local_1148 >> 0x20);
      local_c08._6_2_ = (undefined2)((ulong)local_1148 >> 0x30);
      local_f28 = CONCAT26(local_c08._2_2_,
                           CONCAT24(local_b68._2_2_,
                                    CONCAT22((undefined2)local_c08,(undefined2)local_b68)));
      uStack_f20 = CONCAT26(local_c08._6_2_,
                            CONCAT24(local_b68._6_2_,CONCAT22(local_c08._4_2_,local_b68._4_2_)));
      local_f08 = CONCAT26(uStack_870._2_2_,
                           CONCAT24(uStack_860._2_2_,
                                    CONCAT22((short)uStack_10c0,(undefined2)uStack_860)));
      uStack_f00 = CONCAT26(uStack_870._6_2_,
                            CONCAT24(uStack_860._6_2_,CONCAT22(uStack_870._4_2_,uStack_860._4_2_)));
      local_ef8 = CONCAT26(uStack_890._2_2_,
                           CONCAT24(uStack_880._2_2_,
                                    CONCAT22((short)uStack_10e0,(undefined2)uStack_880)));
      uStack_ef0 = CONCAT26(uStack_890._6_2_,
                            CONCAT24(uStack_880._6_2_,CONCAT22(uStack_890._4_2_,uStack_880._4_2_)));
      local_ee8 = CONCAT26(uStack_8b0._2_2_,
                           CONCAT24(uStack_8a0._2_2_,
                                    CONCAT22((short)uStack_1100,(undefined2)uStack_8a0)));
      uStack_ee0 = CONCAT26(uStack_8b0._6_2_,
                            CONCAT24(uStack_8a0._6_2_,CONCAT22(uStack_8b0._4_2_,uStack_8a0._4_2_)));
      local_ed8 = CONCAT26(uStack_8d0._2_2_,
                           CONCAT24(uStack_8c0._2_2_,
                                    CONCAT22((short)uStack_1120,(undefined2)uStack_8c0)));
      uStack_ed0 = CONCAT26(uStack_8d0._6_2_,
                            CONCAT24(uStack_8c0._6_2_,CONCAT22(uStack_8d0._4_2_,uStack_8c0._4_2_)));
      uStack_980._0_2_ = (undefined2)uStack_1140;
      uStack_980._2_2_ = (undefined2)((ulong)uStack_1140 >> 0x10);
      uStack_980._4_2_ = (undefined2)((ulong)uStack_1140 >> 0x20);
      uStack_980._6_2_ = (undefined2)((ulong)uStack_1140 >> 0x30);
      local_ec8 = CONCAT26(uStack_980._2_2_,
                           CONCAT24(uStack_8e0._2_2_,
                                    CONCAT22((undefined2)uStack_980,(undefined2)uStack_8e0)));
      uStack_ec0 = CONCAT26(uStack_980._6_2_,
                            CONCAT24(uStack_8e0._6_2_,CONCAT22(uStack_980._4_2_,uStack_8e0._4_2_)));
      local_c08 = local_1148;
      uStack_c00 = uStack_1140;
      local_bf8 = local_1138;
      uStack_bf0 = uStack_1130;
      local_be8 = local_1128;
      uStack_be0 = uStack_1120;
      local_bd8 = local_1118;
      uStack_bd0 = uStack_1110;
      local_bc8 = local_1108;
      uStack_bc0 = uStack_1100;
      local_bb8 = local_10f8;
      uStack_bb0 = uStack_10f0;
      local_ba8 = local_10e8;
      uStack_ba0 = uStack_10e0;
      local_b98 = local_10d8;
      uStack_b90 = uStack_10d0;
      local_b88 = local_10c8;
      uStack_b80 = uStack_10c0;
      local_b78 = local_10b8;
      uStack_b70 = uStack_10b0;
      local_b68 = local_1138;
      uStack_b60 = uStack_1130;
      local_b58 = local_1128;
      uStack_b50 = uStack_1120;
      local_b48 = local_1118;
      uStack_b40 = uStack_1110;
      local_b38 = local_1108;
      uStack_b30 = uStack_1100;
      local_b28 = local_10f8;
      uStack_b20 = uStack_10f0;
      local_b18 = local_10e8;
      uStack_b10 = uStack_10e0;
      local_b08 = local_10d8;
      uStack_b00 = uStack_10d0;
      local_af8 = local_10c8;
      uStack_af0 = uStack_10c0;
      local_ae8 = local_10b8;
      uStack_ae0 = uStack_10b0;
      local_ad8 = local_10a8;
      uStack_ad0 = uStack_10a0;
      local_988 = local_1148;
      uStack_980 = uStack_1140;
      local_978 = local_1138;
      uStack_970 = uStack_1130;
      local_968 = local_1128;
      uStack_960 = uStack_1120;
      local_958 = local_1118;
      uStack_950 = uStack_1110;
      local_948 = local_1108;
      uStack_940 = uStack_1100;
      local_938 = local_10f8;
      uStack_930 = uStack_10f0;
      local_928 = local_10e8;
      uStack_920 = uStack_10e0;
      local_918 = local_10d8;
      uStack_910 = uStack_10d0;
      local_908 = local_10c8;
      uStack_900 = uStack_10c0;
      local_8f8 = local_10b8;
      uStack_8f0 = uStack_10b0;
      local_8e8 = local_1138;
      uStack_8e0 = uStack_1130;
      local_8d8 = local_1128;
      uStack_8d0 = uStack_1120;
      local_8c8 = local_1118;
      uStack_8c0 = uStack_1110;
      local_8b8 = local_1108;
      uStack_8b0 = uStack_1100;
      local_8a8 = local_10f8;
      uStack_8a0 = uStack_10f0;
      local_898 = local_10e8;
      uStack_890 = uStack_10e0;
      local_888 = local_10d8;
      uStack_880 = uStack_10d0;
      local_878 = local_10c8;
      uStack_870 = uStack_10c0;
      local_868 = local_10b8;
      uStack_860 = uStack_10b0;
      local_858 = local_10a8;
      uStack_850 = uStack_10a0;
      for (local_e50 = 0; local_e50 < local_e4c; local_e50 = local_e50 + 2) {
        local_1090 = local_e60 + (long)(local_e50 * local_e34 + local_e54) * 2;
        local_da8 = (undefined8 *)(local_1090 + (long)(local_e34 * 0xb) * 2);
        local_1158 = *local_da8;
        uStack_1150 = local_da8[1];
        local_db0 = (undefined8 *)(local_1090 + (long)(local_e34 * 0xc) * 2);
        local_1168 = *local_db0;
        uStack_1160 = local_db0[1];
        local_c18 = local_1148;
        uVar2 = local_c18;
        uStack_c10 = uStack_1140;
        local_c18._0_2_ = (undefined2)local_1148;
        local_c18._2_2_ = (undefined2)((ulong)local_1148 >> 0x10);
        local_c18._4_2_ = (undefined2)((ulong)local_1148 >> 0x20);
        local_c18._6_2_ = (undefined2)((ulong)local_1148 >> 0x30);
        local_c28._0_2_ = (undefined2)local_1158;
        local_c28._2_2_ = (undefined2)((ulong)local_1158 >> 0x10);
        local_c28._4_2_ = (undefined2)((ulong)local_1158 >> 0x20);
        local_c28._6_2_ = (undefined2)((ulong)local_1158 >> 0x30);
        local_fd8 = (undefined2)local_c18;
        uStack_fd6 = (undefined2)local_c28;
        uStack_fd4 = local_c18._2_2_;
        uStack_fd2 = local_c28._2_2_;
        uStack_fd0 = local_c18._4_2_;
        uStack_fce = local_c28._4_2_;
        uStack_fcc = local_c18._6_2_;
        uStack_fca = local_c28._6_2_;
        local_998 = local_1148;
        uStack_990 = uStack_1140;
        uVar3 = uStack_990;
        uStack_990._0_2_ = (undefined2)uStack_1140;
        uStack_990._2_2_ = (undefined2)((ulong)uStack_1140 >> 0x10);
        uStack_990._4_2_ = (undefined2)((ulong)uStack_1140 >> 0x20);
        uStack_990._6_2_ = (undefined2)((ulong)uStack_1140 >> 0x30);
        uStack_9a0._0_2_ = (undefined2)uStack_1150;
        uStack_9a0._2_2_ = (undefined2)((ulong)uStack_1150 >> 0x10);
        uStack_9a0._4_2_ = (undefined2)((ulong)uStack_1150 >> 0x20);
        uStack_9a0._6_2_ = (undefined2)((ulong)uStack_1150 >> 0x30);
        local_f78 = (undefined2)uStack_990;
        uStack_f76 = (undefined2)uStack_9a0;
        uStack_f74 = uStack_990._2_2_;
        uStack_f72 = uStack_9a0._2_2_;
        uStack_f70 = uStack_990._4_2_;
        uStack_f6e = uStack_9a0._4_2_;
        uStack_f6c = uStack_990._6_2_;
        uStack_f6a = uStack_9a0._6_2_;
        local_c48._0_2_ = (undefined2)local_1168;
        local_c48._2_2_ = (undefined2)((ulong)local_1168 >> 0x10);
        local_c48._4_2_ = (undefined2)((ulong)local_1168 >> 0x20);
        local_c48._6_2_ = (undefined2)((ulong)local_1168 >> 0x30);
        local_f18 = (undefined2)local_c28;
        uStack_f16 = (undefined2)local_c48;
        uStack_f14 = local_c28._2_2_;
        uStack_f12 = local_c48._2_2_;
        uStack_f10 = local_c28._4_2_;
        uStack_f0e = local_c48._4_2_;
        uStack_f0c = local_c28._6_2_;
        uStack_f0a = local_c48._6_2_;
        uStack_9c0._0_2_ = (undefined2)uStack_1160;
        uStack_9c0._2_2_ = (undefined2)((ulong)uStack_1160 >> 0x10);
        uStack_9c0._4_2_ = (undefined2)((ulong)uStack_1160 >> 0x20);
        uStack_9c0._6_2_ = (undefined2)((ulong)uStack_1160 >> 0x30);
        local_eb8 = (undefined2)uStack_9a0;
        uStack_eb6 = (undefined2)uStack_9c0;
        uStack_eb4 = uStack_9a0._2_2_;
        uStack_eb2 = uStack_9c0._2_2_;
        uStack_eb0 = uStack_9a0._4_2_;
        uStack_eae = uStack_9c0._4_2_;
        uStack_eac = uStack_9a0._6_2_;
        uStack_eaa = uStack_9c0._6_2_;
        local_c48 = local_1168;
        uStack_c40 = uStack_1160;
        local_c38 = local_1158;
        uStack_c30 = uStack_1150;
        local_c28 = local_1158;
        uStack_c20 = uStack_1150;
        local_c18 = uVar2;
        local_9c8 = local_1168;
        uStack_9c0 = uStack_1160;
        local_9b8 = local_1158;
        uStack_9b0 = uStack_1150;
        local_9a8 = local_1158;
        uStack_9a0 = uStack_1150;
        uStack_990 = uVar3;
        convolve_12tap(in_stack_ffffffffffffeb68,(__m128i *)0x4f2ea4);
        local_668 = local_e88;
        uVar2 = local_668;
        uStack_660 = uStack_e80;
        uVar3 = uStack_660;
        local_658 = (int)extraout_XMM0_Qa;
        iStack_654 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
        iStack_650 = (int)extraout_XMM0_Qb;
        iStack_64c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        local_668._0_4_ = (int)local_e88;
        local_668._4_4_ = (int)((ulong)local_e88 >> 0x20);
        uStack_660._0_4_ = (int)uStack_e80;
        uStack_660._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
        local_758 = local_658 + (int)local_668;
        iStack_754 = iStack_654 + local_668._4_4_;
        iStack_750 = iStack_650 + (int)uStack_660;
        iStack_74c = iStack_64c + uStack_660._4_4_;
        local_768 = local_e78;
        uStack_760 = uStack_e70;
        auVar9._8_8_ = uStack_e70;
        auVar9._0_8_ = local_e78;
        local_1188._4_4_ = iStack_754 >> auVar9;
        local_1188._0_4_ = local_758 >> auVar9;
        local_1188._8_4_ = iStack_750 >> auVar9;
        local_1188._12_4_ = iStack_74c >> auVar9;
        local_668 = uVar2;
        uStack_660 = uVar3;
        convolve_12tap(in_stack_ffffffffffffeb68,(__m128i *)0x4f2f3d);
        uVar38 = uStack_220;
        uVar33 = local_228;
        uVar29 = uStack_3a0;
        uVar28 = local_3a8;
        local_688 = local_e88;
        uVar2 = local_688;
        uStack_680 = uStack_e80;
        uVar3 = uStack_680;
        local_678 = (int)extraout_XMM0_Qa_00;
        iStack_674 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        iStack_670 = (int)extraout_XMM0_Qb_00;
        iStack_66c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        local_688._0_4_ = (int)local_e88;
        local_688._4_4_ = (int)((ulong)local_e88 >> 0x20);
        uStack_680._0_4_ = (int)uStack_e80;
        uStack_680._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
        local_778 = local_678 + (int)local_688;
        iStack_774 = iStack_674 + local_688._4_4_;
        iStack_770 = iStack_670 + (int)uStack_680;
        iStack_76c = iStack_66c + uStack_680._4_4_;
        local_788 = local_e78;
        uStack_780 = uStack_e70;
        auVar8._8_8_ = uStack_e70;
        auVar8._0_8_ = local_e78;
        local_11a8._4_4_ = iStack_774 >> auVar8;
        local_11a8._0_4_ = local_778 >> auVar8;
        local_11a8._8_4_ = iStack_770 >> auVar8;
        local_11a8._12_4_ = iStack_76c >> auVar8;
        local_688 = uVar2;
        uStack_680 = uVar3;
        if (local_e48 - local_e54 < 5) {
          local_3a8._0_2_ = (short)local_e98;
          sVar32 = (short)local_3a8;
          local_3a8._2_2_ = (short)((ulong)local_e98 >> 0x10);
          sVar34 = local_3a8._2_2_;
          local_3a8._4_2_ = (short)((ulong)local_e98 >> 0x20);
          sVar35 = local_3a8._4_2_;
          local_3a8._6_2_ = (short)((ulong)local_e98 >> 0x30);
          sVar36 = local_3a8._6_2_;
          uStack_3a0._0_2_ = (short)uStack_e90;
          sVar37 = (short)uStack_3a0;
          uStack_3a0._2_2_ = (short)((ulong)uStack_e90 >> 0x10);
          sVar39 = uStack_3a0._2_2_;
          uStack_3a0._4_2_ = (short)((ulong)uStack_e90 >> 0x20);
          sVar40 = uStack_3a0._4_2_;
          uStack_3a0._6_2_ = (short)((ulong)uStack_e90 >> 0x30);
          sVar41 = uStack_3a0._6_2_;
          local_228._0_2_ = (short)local_ea8;
          sVar44 = (short)local_228;
          local_228._2_2_ = (short)((ulong)local_ea8 >> 0x10);
          sVar45 = local_228._2_2_;
          local_228._4_2_ = (short)((ulong)local_ea8 >> 0x20);
          sVar46 = local_228._4_2_;
          local_228._6_2_ = (short)((ulong)local_ea8 >> 0x30);
          sVar47 = local_228._6_2_;
          uStack_220._0_2_ = (short)uStack_ea0;
          sVar48 = (short)uStack_220;
          uStack_220._2_2_ = (short)((ulong)uStack_ea0 >> 0x10);
          sVar49 = uStack_220._2_2_;
          uStack_220._4_2_ = (short)((ulong)uStack_ea0 >> 0x20);
          sVar50 = uStack_220._4_2_;
          uStack_220._6_2_ = (short)((ulong)uStack_ea0 >> 0x30);
          sVar51 = uStack_220._6_2_;
          if (local_e48 == 4) {
            local_518 = local_1188._0_8_;
            uStack_510 = local_1188._8_8_;
            local_528 = local_1188._0_8_;
            uStack_520 = local_1188._8_8_;
            auVar54 = packssdw(local_1188,local_1188);
            local_1188._0_8_ = auVar54._0_8_;
            local_1188._8_8_ = auVar54._8_8_;
            local_398 = local_1188._0_8_;
            uVar28 = local_398;
            uStack_390 = local_1188._8_8_;
            uVar29 = uStack_390;
            local_3a8 = local_e98;
            uStack_3a0 = uStack_e90;
            local_398._0_2_ = auVar54._0_2_;
            local_398._2_2_ = auVar54._2_2_;
            local_398._4_2_ = auVar54._4_2_;
            local_398._6_2_ = auVar54._6_2_;
            uStack_390._0_2_ = auVar54._8_2_;
            uStack_390._2_2_ = auVar54._10_2_;
            uStack_390._4_2_ = auVar54._12_2_;
            uStack_390._6_2_ = auVar54._14_2_;
            local_1188._0_2_ =
                 (ushort)(sVar32 < (short)local_398) * sVar32 |
                 (ushort)(sVar32 >= (short)local_398) * (short)local_398;
            local_1188._2_2_ =
                 (ushort)(sVar34 < local_398._2_2_) * sVar34 |
                 (ushort)(sVar34 >= local_398._2_2_) * local_398._2_2_;
            local_1188._4_2_ =
                 (ushort)(sVar35 < local_398._4_2_) * sVar35 |
                 (ushort)(sVar35 >= local_398._4_2_) * local_398._4_2_;
            local_1188._6_2_ =
                 (ushort)(sVar36 < local_398._6_2_) * sVar36 |
                 (ushort)(sVar36 >= local_398._6_2_) * local_398._6_2_;
            uVar52 = (ushort)(sVar37 < (short)uStack_390) * sVar37 |
                     (ushort)(sVar37 >= (short)uStack_390) * (short)uStack_390;
            uVar56 = (ushort)(sVar39 < uStack_390._2_2_) * sVar39 |
                     (ushort)(sVar39 >= uStack_390._2_2_) * uStack_390._2_2_;
            uVar57 = (ushort)(sVar40 < uStack_390._4_2_) * sVar40 |
                     (ushort)(sVar40 >= uStack_390._4_2_) * uStack_390._4_2_;
            uVar59 = (ushort)(sVar41 < uStack_390._6_2_) * sVar41 |
                     (ushort)(sVar41 >= uStack_390._6_2_) * uStack_390._6_2_;
            local_1188._8_2_ = uVar52;
            local_1188._10_2_ = uVar56;
            local_1188._12_2_ = uVar57;
            local_1188._14_2_ = uVar59;
            local_218 = local_1188._0_8_;
            uStack_210 = local_1188._8_8_;
            local_228 = local_ea8;
            uStack_220 = uStack_ea0;
            local_1188._2_2_ =
                 (ushort)((short)local_1188._2_2_ < sVar45) * sVar45 |
                 (ushort)((short)local_1188._2_2_ >= sVar45) * local_1188._2_2_;
            local_1188._0_2_ =
                 (ushort)((short)local_1188._0_2_ < sVar44) * sVar44 |
                 (ushort)((short)local_1188._0_2_ >= sVar44) * local_1188._0_2_;
            local_1188._4_2_ =
                 (ushort)((short)local_1188._4_2_ < sVar46) * sVar46 |
                 (ushort)((short)local_1188._4_2_ >= sVar46) * local_1188._4_2_;
            local_1188._6_2_ =
                 (ushort)((short)local_1188._6_2_ < sVar47) * sVar47 |
                 (ushort)((short)local_1188._6_2_ >= sVar47) * local_1188._6_2_;
            local_1188._8_2_ =
                 (ushort)((short)uVar52 < sVar48) * sVar48 | ((short)uVar52 >= sVar48) * uVar52;
            local_1188._10_2_ =
                 (ushort)((short)uVar56 < sVar49) * sVar49 | ((short)uVar56 >= sVar49) * uVar56;
            local_1188._12_2_ =
                 (ushort)((short)uVar57 < sVar50) * sVar50 | ((short)uVar57 >= sVar50) * uVar57;
            local_1188._14_2_ =
                 (ushort)((short)uVar59 < sVar51) * sVar51 | ((short)uVar59 >= sVar51) * uVar59;
            local_538 = local_11a8._0_8_;
            uStack_530 = local_11a8._8_8_;
            local_548 = local_11a8._0_8_;
            uStack_540 = local_11a8._8_8_;
            auVar25._8_8_ = local_11a8._8_8_;
            auVar25._0_8_ = local_11a8._0_8_;
            auVar24._8_8_ = local_11a8._8_8_;
            auVar24._0_8_ = local_11a8._0_8_;
            auVar54 = packssdw(auVar25,auVar24);
            local_11a8._0_8_ = auVar54._0_8_;
            local_11a8._8_8_ = auVar54._8_8_;
            local_3b8 = local_11a8._0_8_;
            uVar2 = local_3b8;
            uStack_3b0 = local_11a8._8_8_;
            uVar3 = uStack_3b0;
            local_3c8 = local_e98;
            uStack_3c0 = uStack_e90;
            local_3b8._0_2_ = auVar54._0_2_;
            local_3b8._2_2_ = auVar54._2_2_;
            local_3b8._4_2_ = auVar54._4_2_;
            local_3b8._6_2_ = auVar54._6_2_;
            uStack_3b0._0_2_ = auVar54._8_2_;
            uStack_3b0._2_2_ = auVar54._10_2_;
            uStack_3b0._4_2_ = auVar54._12_2_;
            uStack_3b0._6_2_ = auVar54._14_2_;
            local_11a8._0_2_ =
                 (ushort)(sVar32 < (short)local_3b8) * sVar32 |
                 (ushort)(sVar32 >= (short)local_3b8) * (short)local_3b8;
            local_11a8._2_2_ =
                 (ushort)(sVar34 < local_3b8._2_2_) * sVar34 |
                 (ushort)(sVar34 >= local_3b8._2_2_) * local_3b8._2_2_;
            local_11a8._4_2_ =
                 (ushort)(sVar35 < local_3b8._4_2_) * sVar35 |
                 (ushort)(sVar35 >= local_3b8._4_2_) * local_3b8._4_2_;
            local_11a8._6_2_ =
                 (ushort)(sVar36 < local_3b8._6_2_) * sVar36 |
                 (ushort)(sVar36 >= local_3b8._6_2_) * local_3b8._6_2_;
            uVar52 = (ushort)(sVar37 < (short)uStack_3b0) * sVar37 |
                     (ushort)(sVar37 >= (short)uStack_3b0) * (short)uStack_3b0;
            uVar56 = (ushort)(sVar39 < uStack_3b0._2_2_) * sVar39 |
                     (ushort)(sVar39 >= uStack_3b0._2_2_) * uStack_3b0._2_2_;
            uVar57 = (ushort)(sVar40 < uStack_3b0._4_2_) * sVar40 |
                     (ushort)(sVar40 >= uStack_3b0._4_2_) * uStack_3b0._4_2_;
            uVar59 = (ushort)(sVar41 < uStack_3b0._6_2_) * sVar41 |
                     (ushort)(sVar41 >= uStack_3b0._6_2_) * uStack_3b0._6_2_;
            local_11a8._8_2_ = uVar52;
            local_11a8._10_2_ = uVar56;
            local_11a8._12_2_ = uVar57;
            local_11a8._14_2_ = uVar59;
            local_238 = local_11a8._0_8_;
            uStack_230 = local_11a8._8_8_;
            local_248 = local_ea8;
            uStack_240 = uStack_ea0;
            local_11a8._2_2_ =
                 (ushort)((short)local_11a8._2_2_ < sVar45) * sVar45 |
                 (ushort)((short)local_11a8._2_2_ >= sVar45) * local_11a8._2_2_;
            local_11a8._0_2_ =
                 (ushort)((short)local_11a8._0_2_ < sVar44) * sVar44 |
                 (ushort)((short)local_11a8._0_2_ >= sVar44) * local_11a8._0_2_;
            local_11a8._4_2_ =
                 (ushort)((short)local_11a8._4_2_ < sVar46) * sVar46 |
                 (ushort)((short)local_11a8._4_2_ >= sVar46) * local_11a8._4_2_;
            local_11a8._6_2_ =
                 (ushort)((short)local_11a8._6_2_ < sVar47) * sVar47 |
                 (ushort)((short)local_11a8._6_2_ >= sVar47) * local_11a8._6_2_;
            local_11a8._8_2_ =
                 (ushort)((short)uVar52 < sVar48) * sVar48 | ((short)uVar52 >= sVar48) * uVar52;
            local_11a8._10_2_ =
                 (ushort)((short)uVar56 < sVar49) * sVar49 | ((short)uVar56 >= sVar49) * uVar56;
            local_11a8._12_2_ =
                 (ushort)((short)uVar57 < sVar50) * sVar50 | ((short)uVar57 >= sVar50) * uVar57;
            local_11a8._14_2_ =
                 (ushort)((short)uVar59 < sVar51) * sVar51 | ((short)uVar59 >= sVar51) * uVar59;
            local_d0 = (undefined8 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54) * 2);
            local_e8 = local_1188._0_8_;
            uStack_e0 = local_1188._8_8_;
            *local_d0 = local_1188._0_8_;
            local_f0 = (undefined8 *)
                       (local_e40 + (long)(local_e50 * local_e44 + local_e54 + local_e44) * 2);
            local_108 = local_11a8._0_8_;
            uStack_100 = local_11a8._8_8_;
            *local_f0 = local_11a8._0_8_;
            local_3b8 = uVar2;
            uStack_3b0 = uVar3;
            local_398 = uVar28;
            uStack_390 = uVar29;
          }
          else {
            local_558 = local_1188._0_8_;
            uStack_550 = local_1188._8_8_;
            local_568 = local_1188._0_8_;
            uStack_560 = local_1188._8_8_;
            auVar54 = packssdw(local_1188,local_1188);
            local_1188._0_8_ = auVar54._0_8_;
            local_1188._8_8_ = auVar54._8_8_;
            local_3d8 = local_1188._0_8_;
            uVar42 = local_3d8;
            uStack_3d0 = local_1188._8_8_;
            uVar43 = uStack_3d0;
            local_3e8 = local_e98;
            uStack_3e0 = uStack_e90;
            local_3d8._0_2_ = auVar54._0_2_;
            local_3d8._2_2_ = auVar54._2_2_;
            local_3d8._4_2_ = auVar54._4_2_;
            local_3d8._6_2_ = auVar54._6_2_;
            uStack_3d0._0_2_ = auVar54._8_2_;
            uStack_3d0._2_2_ = auVar54._10_2_;
            uStack_3d0._4_2_ = auVar54._12_2_;
            uStack_3d0._6_2_ = auVar54._14_2_;
            local_1188._0_2_ =
                 (ushort)((short)local_3a8 < (short)local_3d8) * (short)local_3a8 |
                 (ushort)((short)local_3a8 >= (short)local_3d8) * (short)local_3d8;
            local_1188._2_2_ =
                 (ushort)(local_3a8._2_2_ < local_3d8._2_2_) * local_3a8._2_2_ |
                 (ushort)(local_3a8._2_2_ >= local_3d8._2_2_) * local_3d8._2_2_;
            local_1188._4_2_ =
                 (ushort)(local_3a8._4_2_ < local_3d8._4_2_) * local_3a8._4_2_ |
                 (ushort)(local_3a8._4_2_ >= local_3d8._4_2_) * local_3d8._4_2_;
            local_1188._6_2_ =
                 (ushort)(local_3a8._6_2_ < local_3d8._6_2_) * local_3a8._6_2_ |
                 (ushort)(local_3a8._6_2_ >= local_3d8._6_2_) * local_3d8._6_2_;
            uVar52 = (ushort)((short)uStack_3a0 < (short)uStack_3d0) * (short)uStack_3a0 |
                     (ushort)((short)uStack_3a0 >= (short)uStack_3d0) * (short)uStack_3d0;
            uVar56 = (ushort)(uStack_3a0._2_2_ < uStack_3d0._2_2_) * uStack_3a0._2_2_ |
                     (ushort)(uStack_3a0._2_2_ >= uStack_3d0._2_2_) * uStack_3d0._2_2_;
            uVar57 = (ushort)(uStack_3a0._4_2_ < uStack_3d0._4_2_) * uStack_3a0._4_2_ |
                     (ushort)(uStack_3a0._4_2_ >= uStack_3d0._4_2_) * uStack_3d0._4_2_;
            uVar59 = (ushort)(uStack_3a0._6_2_ < uStack_3d0._6_2_) * uStack_3a0._6_2_ |
                     (ushort)(uStack_3a0._6_2_ >= uStack_3d0._6_2_) * uStack_3d0._6_2_;
            local_1188._8_2_ = uVar52;
            local_1188._10_2_ = uVar56;
            local_1188._12_2_ = uVar57;
            local_1188._14_2_ = uVar59;
            local_258 = local_1188._0_8_;
            uStack_250 = local_1188._8_8_;
            local_268 = local_ea8;
            uStack_260 = uStack_ea0;
            local_1188._2_2_ =
                 (ushort)((short)local_1188._2_2_ < local_228._2_2_) * local_228._2_2_ |
                 (ushort)((short)local_1188._2_2_ >= local_228._2_2_) * local_1188._2_2_;
            local_1188._0_2_ =
                 (ushort)((short)local_1188._0_2_ < (short)local_228) * (short)local_228 |
                 (ushort)((short)local_1188._0_2_ >= (short)local_228) * local_1188._0_2_;
            local_1188._4_2_ =
                 (ushort)((short)local_1188._4_2_ < local_228._4_2_) * local_228._4_2_ |
                 (ushort)((short)local_1188._4_2_ >= local_228._4_2_) * local_1188._4_2_;
            local_1188._6_2_ =
                 (ushort)((short)local_1188._6_2_ < local_228._6_2_) * local_228._6_2_ |
                 (ushort)((short)local_1188._6_2_ >= local_228._6_2_) * local_1188._6_2_;
            local_1188._8_2_ =
                 (ushort)((short)uVar52 < (short)uStack_220) * (short)uStack_220 |
                 ((short)uVar52 >= (short)uStack_220) * uVar52;
            local_1188._10_2_ =
                 (ushort)((short)uVar56 < uStack_220._2_2_) * uStack_220._2_2_ |
                 ((short)uVar56 >= uStack_220._2_2_) * uVar56;
            local_1188._12_2_ =
                 (ushort)((short)uVar57 < uStack_220._4_2_) * uStack_220._4_2_ |
                 ((short)uVar57 >= uStack_220._4_2_) * uVar57;
            local_1188._14_2_ =
                 (ushort)((short)uVar59 < uStack_220._6_2_) * uStack_220._6_2_ |
                 ((short)uVar59 >= uStack_220._6_2_) * uVar59;
            local_578 = local_11a8._0_8_;
            uStack_570 = local_11a8._8_8_;
            local_588 = local_11a8._0_8_;
            uStack_580 = local_11a8._8_8_;
            auVar23._8_8_ = local_11a8._8_8_;
            auVar23._0_8_ = local_11a8._0_8_;
            auVar22._8_8_ = local_11a8._8_8_;
            auVar22._0_8_ = local_11a8._0_8_;
            auVar54 = packssdw(auVar23,auVar22);
            local_11a8._0_8_ = auVar54._0_8_;
            local_11a8._8_8_ = auVar54._8_8_;
            local_3f8 = local_11a8._0_8_;
            uVar2 = local_3f8;
            uStack_3f0 = local_11a8._8_8_;
            uVar3 = uStack_3f0;
            local_408 = local_e98;
            uStack_400 = uStack_e90;
            local_3f8._0_2_ = auVar54._0_2_;
            local_3f8._2_2_ = auVar54._2_2_;
            local_3f8._4_2_ = auVar54._4_2_;
            local_3f8._6_2_ = auVar54._6_2_;
            uStack_3f0._0_2_ = auVar54._8_2_;
            uStack_3f0._2_2_ = auVar54._10_2_;
            uStack_3f0._4_2_ = auVar54._12_2_;
            uStack_3f0._6_2_ = auVar54._14_2_;
            local_11a8._0_2_ =
                 (ushort)((short)local_3a8 < (short)local_3f8) * (short)local_3a8 |
                 (ushort)((short)local_3a8 >= (short)local_3f8) * (short)local_3f8;
            local_11a8._2_2_ =
                 (ushort)(local_3a8._2_2_ < local_3f8._2_2_) * local_3a8._2_2_ |
                 (ushort)(local_3a8._2_2_ >= local_3f8._2_2_) * local_3f8._2_2_;
            local_11a8._4_2_ =
                 (ushort)(local_3a8._4_2_ < local_3f8._4_2_) * local_3a8._4_2_ |
                 (ushort)(local_3a8._4_2_ >= local_3f8._4_2_) * local_3f8._4_2_;
            local_11a8._6_2_ =
                 (ushort)(local_3a8._6_2_ < local_3f8._6_2_) * local_3a8._6_2_ |
                 (ushort)(local_3a8._6_2_ >= local_3f8._6_2_) * local_3f8._6_2_;
            uVar52 = (ushort)((short)uStack_3a0 < (short)uStack_3f0) * (short)uStack_3a0 |
                     (ushort)((short)uStack_3a0 >= (short)uStack_3f0) * (short)uStack_3f0;
            uVar56 = (ushort)(uStack_3a0._2_2_ < uStack_3f0._2_2_) * uStack_3a0._2_2_ |
                     (ushort)(uStack_3a0._2_2_ >= uStack_3f0._2_2_) * uStack_3f0._2_2_;
            uVar57 = (ushort)(uStack_3a0._4_2_ < uStack_3f0._4_2_) * uStack_3a0._4_2_ |
                     (ushort)(uStack_3a0._4_2_ >= uStack_3f0._4_2_) * uStack_3f0._4_2_;
            uVar59 = (ushort)(uStack_3a0._6_2_ < uStack_3f0._6_2_) * uStack_3a0._6_2_ |
                     (ushort)(uStack_3a0._6_2_ >= uStack_3f0._6_2_) * uStack_3f0._6_2_;
            local_11a8._8_2_ = uVar52;
            local_11a8._10_2_ = uVar56;
            local_11a8._12_2_ = uVar57;
            local_11a8._14_2_ = uVar59;
            local_278 = local_11a8._0_8_;
            uStack_270 = local_11a8._8_8_;
            local_288 = local_ea8;
            uStack_280 = uStack_ea0;
            local_11a8._2_2_ =
                 (ushort)((short)local_11a8._2_2_ < local_228._2_2_) * local_228._2_2_ |
                 (ushort)((short)local_11a8._2_2_ >= local_228._2_2_) * local_11a8._2_2_;
            local_11a8._0_2_ =
                 (ushort)((short)local_11a8._0_2_ < (short)local_228) * (short)local_228 |
                 (ushort)((short)local_11a8._0_2_ >= (short)local_228) * local_11a8._0_2_;
            local_11a8._4_2_ =
                 (ushort)((short)local_11a8._4_2_ < local_228._4_2_) * local_228._4_2_ |
                 (ushort)((short)local_11a8._4_2_ >= local_228._4_2_) * local_11a8._4_2_;
            local_11a8._6_2_ =
                 (ushort)((short)local_11a8._6_2_ < local_228._6_2_) * local_228._6_2_ |
                 (ushort)((short)local_11a8._6_2_ >= local_228._6_2_) * local_11a8._6_2_;
            local_11a8._8_2_ =
                 (ushort)((short)uVar52 < (short)uStack_220) * (short)uStack_220 |
                 ((short)uVar52 >= (short)uStack_220) * uVar52;
            local_11a8._10_2_ =
                 (ushort)((short)uVar56 < uStack_220._2_2_) * uStack_220._2_2_ |
                 ((short)uVar56 >= uStack_220._2_2_) * uVar56;
            local_11a8._12_2_ =
                 (ushort)((short)uVar57 < uStack_220._4_2_) * uStack_220._4_2_ |
                 ((short)uVar57 >= uStack_220._4_2_) * uVar57;
            local_11a8._14_2_ =
                 (ushort)((short)uVar59 < uStack_220._6_2_) * uStack_220._6_2_ |
                 ((short)uVar59 >= uStack_220._6_2_) * uVar59;
            local_58 = local_1188._0_8_;
            uStack_50 = local_1188._8_8_;
            local_68 = local_1188._0_8_;
            uStack_60 = local_1188._8_8_;
            *(undefined4 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54) * 2) =
                 local_1188._0_4_;
            local_78 = local_11a8._0_8_;
            uStack_70 = local_11a8._8_8_;
            local_88 = local_11a8._0_8_;
            uStack_80 = local_11a8._8_8_;
            *(undefined4 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54 + local_e44) * 2) =
                 local_11a8._0_4_;
            local_3f8 = uVar2;
            uStack_3f0 = uVar3;
            local_3d8 = uVar42;
            uStack_3d0 = uVar43;
            local_3a8 = uVar28;
            uStack_3a0 = uVar29;
            local_228 = uVar33;
            uStack_220 = uVar38;
          }
        }
        else {
          convolve_12tap(in_stack_ffffffffffffeb68,(__m128i *)0x4f2fea);
          local_6a8 = local_e88;
          uVar2 = local_6a8;
          uStack_6a0 = uStack_e80;
          uVar3 = uStack_6a0;
          local_698 = (int)extraout_XMM0_Qa_01;
          iStack_694 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
          iStack_690 = (int)extraout_XMM0_Qb_01;
          iStack_68c = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          local_6a8._0_4_ = (int)local_e88;
          local_6a8._4_4_ = (int)((ulong)local_e88 >> 0x20);
          uStack_6a0._0_4_ = (int)uStack_e80;
          uStack_6a0._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
          local_798 = local_698 + (int)local_6a8;
          iStack_794 = iStack_694 + local_6a8._4_4_;
          iStack_790 = iStack_690 + (int)uStack_6a0;
          iStack_78c = iStack_68c + uStack_6a0._4_4_;
          local_7a8 = local_e78;
          uStack_7a0 = uStack_e70;
          auVar7._8_8_ = uStack_e70;
          auVar7._0_8_ = local_e78;
          local_11c8 = local_798 >> auVar7;
          iStack_11c4 = iStack_794 >> auVar7;
          iStack_11c0 = iStack_790 >> auVar7;
          iStack_11bc = iStack_78c >> auVar7;
          local_6a8 = uVar2;
          uStack_6a0 = uVar3;
          convolve_12tap(in_stack_ffffffffffffeb68,(__m128i *)0x4f3083);
          local_6c8 = local_e88;
          uVar2 = local_6c8;
          uStack_6c0 = uStack_e80;
          uVar3 = uStack_6c0;
          local_6b8 = (int)extraout_XMM0_Qa_02;
          iStack_6b4 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
          iStack_6b0 = (int)extraout_XMM0_Qb_02;
          iStack_6ac = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
          local_6c8._0_4_ = (int)local_e88;
          local_6c8._4_4_ = (int)((ulong)local_e88 >> 0x20);
          uStack_6c0._0_4_ = (int)uStack_e80;
          uStack_6c0._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
          local_7b8 = local_6b8 + (int)local_6c8;
          iStack_7b4 = iStack_6b4 + local_6c8._4_4_;
          iStack_7b0 = iStack_6b0 + (int)uStack_6c0;
          iStack_7ac = iStack_6ac + uStack_6c0._4_4_;
          local_7c8 = local_e78;
          uStack_7c0 = uStack_e70;
          auVar6._8_8_ = uStack_e70;
          auVar6._0_8_ = local_e78;
          local_11e8 = local_7b8 >> auVar6;
          iStack_11e4 = iStack_7b4 >> auVar6;
          iStack_11e0 = iStack_7b0 >> auVar6;
          iStack_11dc = iStack_7ac >> auVar6;
          local_4e8 = CONCAT44(iStack_11c4,local_11c8);
          uStack_4e0 = CONCAT44(iStack_11bc,iStack_11c0);
          local_4d8 = local_1188._0_8_;
          uStack_4d0 = local_1188._8_8_;
          auVar27._8_8_ = uStack_4e0;
          auVar27._0_8_ = local_4e8;
          auVar54 = packssdw(local_1188,auVar27);
          local_11f8 = auVar54._0_8_;
          uStack_11f0 = auVar54._8_8_;
          local_358 = local_11f8;
          uVar42 = local_358;
          uStack_350 = uStack_11f0;
          uVar43 = uStack_350;
          local_368 = local_e98;
          uVar33 = local_368;
          uStack_360 = uStack_e90;
          uVar38 = uStack_360;
          local_358._0_2_ = auVar54._0_2_;
          local_358._2_2_ = auVar54._2_2_;
          local_358._4_2_ = auVar54._4_2_;
          local_358._6_2_ = auVar54._6_2_;
          uStack_350._0_2_ = auVar54._8_2_;
          uStack_350._2_2_ = auVar54._10_2_;
          uStack_350._4_2_ = auVar54._12_2_;
          uStack_350._6_2_ = auVar54._14_2_;
          local_368._0_2_ = (short)local_e98;
          local_368._2_2_ = (short)((ulong)local_e98 >> 0x10);
          local_368._4_2_ = (short)((ulong)local_e98 >> 0x20);
          local_368._6_2_ = (short)((ulong)local_e98 >> 0x30);
          uStack_360._0_2_ = (short)uStack_e90;
          uStack_360._2_2_ = (short)((ulong)uStack_e90 >> 0x10);
          uStack_360._4_2_ = (short)((ulong)uStack_e90 >> 0x20);
          uStack_360._6_2_ = (short)((ulong)uStack_e90 >> 0x30);
          uVar52 = (ushort)((short)local_368 < (short)local_358) * (short)local_368 |
                   (ushort)((short)local_368 >= (short)local_358) * (short)local_358;
          uVar56 = (ushort)(local_368._2_2_ < local_358._2_2_) * local_368._2_2_ |
                   (ushort)(local_368._2_2_ >= local_358._2_2_) * local_358._2_2_;
          uVar57 = (ushort)(local_368._4_2_ < local_358._4_2_) * local_368._4_2_ |
                   (ushort)(local_368._4_2_ >= local_358._4_2_) * local_358._4_2_;
          uVar59 = (ushort)(local_368._6_2_ < local_358._6_2_) * local_368._6_2_ |
                   (ushort)(local_368._6_2_ >= local_358._6_2_) * local_358._6_2_;
          uVar60 = (ushort)((short)uStack_360 < (short)uStack_350) * (short)uStack_360 |
                   (ushort)((short)uStack_360 >= (short)uStack_350) * (short)uStack_350;
          uVar62 = (ushort)(uStack_360._2_2_ < uStack_350._2_2_) * uStack_360._2_2_ |
                   (ushort)(uStack_360._2_2_ >= uStack_350._2_2_) * uStack_350._2_2_;
          uVar63 = (ushort)(uStack_360._4_2_ < uStack_350._4_2_) * uStack_360._4_2_ |
                   (ushort)(uStack_360._4_2_ >= uStack_350._4_2_) * uStack_350._4_2_;
          uVar65 = (ushort)(uStack_360._6_2_ < uStack_350._6_2_) * uStack_360._6_2_ |
                   (ushort)(uStack_360._6_2_ >= uStack_350._6_2_) * uStack_350._6_2_;
          local_11f8._0_4_ = CONCAT22(uVar56,uVar52);
          local_11f8._0_6_ = CONCAT24(uVar57,(undefined4)local_11f8);
          local_11f8 = CONCAT26(uVar59,(undefined6)local_11f8);
          uStack_11f0._0_2_ = uVar60;
          uStack_11f0._2_2_ = uVar62;
          uStack_11f0._4_2_ = uVar63;
          uStack_11f0._6_2_ = uVar65;
          local_1d8 = local_11f8;
          uStack_1d0 = uStack_11f0;
          local_1e8 = local_ea8;
          uVar30 = local_1e8;
          uStack_1e0 = uStack_ea0;
          uVar31 = uStack_1e0;
          local_1e8._0_2_ = (short)local_ea8;
          local_1e8._2_2_ = (short)((ulong)local_ea8 >> 0x10);
          local_1e8._4_2_ = (short)((ulong)local_ea8 >> 0x20);
          local_1e8._6_2_ = (short)((ulong)local_ea8 >> 0x30);
          uStack_1e0._0_2_ = (short)uStack_ea0;
          uStack_1e0._2_2_ = (short)((ulong)uStack_ea0 >> 0x10);
          uStack_1e0._4_2_ = (short)((ulong)uStack_ea0 >> 0x20);
          uStack_1e0._6_2_ = (short)((ulong)uStack_ea0 >> 0x30);
          local_11f8._0_4_ =
               CONCAT22((ushort)((short)uVar56 < local_1e8._2_2_) * local_1e8._2_2_ |
                        ((short)uVar56 >= local_1e8._2_2_) * uVar56,
                        (ushort)((short)uVar52 < (short)local_1e8) * (short)local_1e8 |
                        ((short)uVar52 >= (short)local_1e8) * uVar52);
          local_11f8._0_6_ =
               CONCAT24((ushort)((short)uVar57 < local_1e8._4_2_) * local_1e8._4_2_ |
                        ((short)uVar57 >= local_1e8._4_2_) * uVar57,(undefined4)local_11f8);
          local_11f8 = CONCAT26((ushort)((short)uVar59 < local_1e8._6_2_) * local_1e8._6_2_ |
                                ((short)uVar59 >= local_1e8._6_2_) * uVar59,(undefined6)local_11f8);
          uStack_11f0._0_2_ =
               (ushort)((short)uVar60 < (short)uStack_1e0) * (short)uStack_1e0 |
               ((short)uVar60 >= (short)uStack_1e0) * uVar60;
          uStack_11f0._2_2_ =
               (ushort)((short)uVar62 < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
               ((short)uVar62 >= uStack_1e0._2_2_) * uVar62;
          uStack_11f0._4_2_ =
               (ushort)((short)uVar63 < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
               ((short)uVar63 >= uStack_1e0._4_2_) * uVar63;
          uStack_11f0._6_2_ =
               (ushort)((short)uVar65 < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
               ((short)uVar65 >= uStack_1e0._6_2_) * uVar65;
          local_508 = CONCAT44(iStack_11e4,local_11e8);
          uStack_500 = CONCAT44(iStack_11dc,iStack_11e0);
          local_4f8 = local_11a8._0_8_;
          uStack_4f0 = local_11a8._8_8_;
          auVar26._8_8_ = uStack_500;
          auVar26._0_8_ = local_508;
          auVar54 = packssdw(local_11a8,auVar26);
          local_1208 = auVar54._0_8_;
          uStack_1200 = auVar54._8_8_;
          local_378 = local_1208;
          uVar28 = local_378;
          uStack_370 = uStack_1200;
          uVar29 = uStack_370;
          local_388 = local_e98;
          uStack_380 = uStack_e90;
          local_378._0_2_ = auVar54._0_2_;
          local_378._2_2_ = auVar54._2_2_;
          local_378._4_2_ = auVar54._4_2_;
          local_378._6_2_ = auVar54._6_2_;
          uStack_370._0_2_ = auVar54._8_2_;
          uStack_370._2_2_ = auVar54._10_2_;
          uStack_370._4_2_ = auVar54._12_2_;
          uStack_370._6_2_ = auVar54._14_2_;
          uVar52 = (ushort)((short)local_368 < (short)local_378) * (short)local_368 |
                   (ushort)((short)local_368 >= (short)local_378) * (short)local_378;
          uVar56 = (ushort)(local_368._2_2_ < local_378._2_2_) * local_368._2_2_ |
                   (ushort)(local_368._2_2_ >= local_378._2_2_) * local_378._2_2_;
          uVar57 = (ushort)(local_368._4_2_ < local_378._4_2_) * local_368._4_2_ |
                   (ushort)(local_368._4_2_ >= local_378._4_2_) * local_378._4_2_;
          uVar59 = (ushort)(local_368._6_2_ < local_378._6_2_) * local_368._6_2_ |
                   (ushort)(local_368._6_2_ >= local_378._6_2_) * local_378._6_2_;
          uVar60 = (ushort)((short)uStack_360 < (short)uStack_370) * (short)uStack_360 |
                   (ushort)((short)uStack_360 >= (short)uStack_370) * (short)uStack_370;
          uVar62 = (ushort)(uStack_360._2_2_ < uStack_370._2_2_) * uStack_360._2_2_ |
                   (ushort)(uStack_360._2_2_ >= uStack_370._2_2_) * uStack_370._2_2_;
          uVar63 = (ushort)(uStack_360._4_2_ < uStack_370._4_2_) * uStack_360._4_2_ |
                   (ushort)(uStack_360._4_2_ >= uStack_370._4_2_) * uStack_370._4_2_;
          uVar65 = (ushort)(uStack_360._6_2_ < uStack_370._6_2_) * uStack_360._6_2_ |
                   (ushort)(uStack_360._6_2_ >= uStack_370._6_2_) * uStack_370._6_2_;
          local_1208._0_4_ = CONCAT22(uVar56,uVar52);
          local_1208._0_6_ = CONCAT24(uVar57,(undefined4)local_1208);
          local_1208 = CONCAT26(uVar59,(undefined6)local_1208);
          uStack_1200._0_2_ = uVar60;
          uStack_1200._2_2_ = uVar62;
          uStack_1200._4_2_ = uVar63;
          uStack_1200._6_2_ = uVar65;
          local_1f8 = local_1208;
          uStack_1f0 = uStack_1200;
          local_208 = local_ea8;
          uStack_200 = uStack_ea0;
          local_1208._0_4_ =
               CONCAT22((ushort)((short)uVar56 < local_1e8._2_2_) * local_1e8._2_2_ |
                        ((short)uVar56 >= local_1e8._2_2_) * uVar56,
                        (ushort)((short)uVar52 < (short)local_1e8) * (short)local_1e8 |
                        ((short)uVar52 >= (short)local_1e8) * uVar52);
          local_1208._0_6_ =
               CONCAT24((ushort)((short)uVar57 < local_1e8._4_2_) * local_1e8._4_2_ |
                        ((short)uVar57 >= local_1e8._4_2_) * uVar57,(undefined4)local_1208);
          local_1208 = CONCAT26((ushort)((short)uVar59 < local_1e8._6_2_) * local_1e8._6_2_ |
                                ((short)uVar59 >= local_1e8._6_2_) * uVar59,(undefined6)local_1208);
          uStack_1200._0_2_ =
               (ushort)((short)uVar60 < (short)uStack_1e0) * (short)uStack_1e0 |
               ((short)uVar60 >= (short)uStack_1e0) * uVar60;
          uStack_1200._2_2_ =
               (ushort)((short)uVar62 < uStack_1e0._2_2_) * uStack_1e0._2_2_ |
               ((short)uVar62 >= uStack_1e0._2_2_) * uVar62;
          uStack_1200._4_2_ =
               (ushort)((short)uVar63 < uStack_1e0._4_2_) * uStack_1e0._4_2_ |
               ((short)uVar63 >= uStack_1e0._4_2_) * uVar63;
          uStack_1200._6_2_ =
               (ushort)((short)uVar65 < uStack_1e0._6_2_) * uStack_1e0._6_2_ |
               ((short)uVar65 >= uStack_1e0._6_2_) * uVar65;
          local_150 = (undefined8 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54) * 2);
          local_168 = local_11f8;
          uStack_160 = uStack_11f0;
          *local_150 = local_11f8;
          local_150[1] = uStack_11f0;
          local_170 = (undefined8 *)
                      (local_e40 + (long)(local_e50 * local_e44 + local_e54 + local_e44) * 2);
          local_188 = local_1208;
          uStack_180 = uStack_1200;
          *local_170 = local_1208;
          local_170[1] = uStack_1200;
          local_6c8 = uVar2;
          uStack_6c0 = uVar3;
          local_378 = uVar28;
          uStack_370 = uVar29;
          local_368 = uVar33;
          uStack_360 = uVar38;
          local_358 = uVar42;
          uStack_350 = uVar43;
          local_1e8 = uVar30;
          uStack_1e0 = uVar31;
        }
        local_1028 = local_1018;
        uStack_1020 = uStack_1010;
        local_1018 = local_1008;
        uStack_1010 = uStack_1000;
        local_1008 = local_ff8;
        uStack_1000 = uStack_ff0;
        local_ff8 = local_fe8;
        uStack_ff0 = uStack_fe0;
        local_fe8 = CONCAT26(uStack_fd2,CONCAT24(uStack_fd4,CONCAT22(uStack_fd6,local_fd8)));
        uStack_fe0 = CONCAT26(uStack_fca,CONCAT24(uStack_fcc,CONCAT22(uStack_fce,uStack_fd0)));
        local_fc8 = local_fb8;
        uStack_fc0 = uStack_fb0;
        local_fb8 = local_fa8;
        uStack_fb0 = uStack_fa0;
        local_fa8 = local_f98;
        uStack_fa0 = uStack_f90;
        local_f98 = local_f88;
        uStack_f90 = uStack_f80;
        local_f88 = CONCAT26(uStack_f72,CONCAT24(uStack_f74,CONCAT22(uStack_f76,local_f78)));
        uStack_f80 = CONCAT26(uStack_f6a,CONCAT24(uStack_f6c,CONCAT22(uStack_f6e,uStack_f70)));
        local_f68 = local_f58;
        uStack_f60 = uStack_f50;
        local_f58 = local_f48;
        uStack_f50 = uStack_f40;
        local_f48 = local_f38;
        uStack_f40 = uStack_f30;
        local_f38 = local_f28;
        uStack_f30 = uStack_f20;
        local_f28 = CONCAT26(uStack_f12,CONCAT24(uStack_f14,CONCAT22(uStack_f16,local_f18)));
        uStack_f20 = CONCAT26(uStack_f0a,CONCAT24(uStack_f0c,CONCAT22(uStack_f0e,uStack_f10)));
        local_f08 = local_ef8;
        uStack_f00 = uStack_ef0;
        local_ef8 = local_ee8;
        uStack_ef0 = uStack_ee0;
        local_ee8 = local_ed8;
        uStack_ee0 = uStack_ed0;
        local_ed8 = local_ec8;
        uStack_ed0 = uStack_ec0;
        local_ec8 = CONCAT26(uStack_eb2,CONCAT24(uStack_eb4,CONCAT22(uStack_eb6,local_eb8)));
        uStack_ec0 = CONCAT26(uStack_eaa,CONCAT24(uStack_eac,CONCAT22(uStack_eae,uStack_eb0)));
        local_1148 = local_1168;
        uStack_1140 = uStack_1160;
      }
    }
  }
  else {
    prepare_coeffs(in_stack_ffffffffffffeb88._0_8_,in_stack_ffffffffffffeb78._12_4_,
                   in_stack_ffffffffffffeb78._0_8_);
    for (local_e54 = 0; local_e54 < local_e48; local_e54 = local_e54 + 8) {
      local_db8 = (undefined8 *)(local_e60 + (long)local_e54 * 2);
      local_9d8 = *local_db8;
      uStack_c50 = local_db8[1];
      local_dc0 = (undefined8 *)((long)local_db8 + (long)local_e34 * 2);
      local_cb8 = *local_dc0;
      uStack_cb0 = local_dc0[1];
      local_dc8 = (undefined8 *)((long)local_db8 + (long)(local_e34 * 2) * 2);
      local_cc8 = *local_dc8;
      uStack_cc0 = local_dc8[1];
      local_dd0 = (undefined8 *)((long)local_db8 + (long)(local_e34 * 3) * 2);
      local_cd8 = *local_dd0;
      uStack_cd0 = local_dd0[1];
      local_dd8 = (undefined8 *)((long)local_db8 + (long)(local_e34 << 2) * 2);
      local_ce8 = *local_dd8;
      uStack_ce0 = local_dd8[1];
      local_de0 = (undefined8 *)((long)local_db8 + (long)(local_e34 * 5) * 2);
      local_cf8 = *local_de0;
      uStack_cf0 = local_de0[1];
      local_de8 = (undefined8 *)((long)local_db8 + (long)(local_e34 * 6) * 2);
      local_a88 = *local_de8;
      uStack_d00 = local_de8[1];
      local_c58._2_2_ = (undefined2)((ulong)local_9d8 >> 0x10);
      local_c58._4_2_ = (undefined2)((ulong)local_9d8 >> 0x20);
      local_c58._6_2_ = (undefined2)((ulong)local_9d8 >> 0x30);
      local_c68._0_2_ = (undefined2)local_cb8;
      local_c68._2_2_ = (undefined2)((ulong)local_cb8 >> 0x10);
      local_c68._4_2_ = (undefined2)((ulong)local_cb8 >> 0x20);
      local_c68._6_2_ = (undefined2)((ulong)local_cb8 >> 0x30);
      local_1308 = CONCAT26(local_c68._2_2_,
                            CONCAT24(local_c58._2_2_,
                                     CONCAT22((undefined2)local_c68,(short)local_9d8)));
      uStack_1300 = CONCAT26(local_c68._6_2_,
                             CONCAT24(local_c58._6_2_,CONCAT22(local_c68._4_2_,local_c58._4_2_)));
      local_c78._2_2_ = (undefined2)((ulong)local_cc8 >> 0x10);
      local_c78._4_2_ = (undefined2)((ulong)local_cc8 >> 0x20);
      local_c78._6_2_ = (undefined2)((ulong)local_cc8 >> 0x30);
      local_c88._0_2_ = (undefined2)local_cd8;
      local_c88._2_2_ = (undefined2)((ulong)local_cd8 >> 0x10);
      local_c88._4_2_ = (undefined2)((ulong)local_cd8 >> 0x20);
      local_c88._6_2_ = (undefined2)((ulong)local_cd8 >> 0x30);
      local_12f8 = CONCAT26(local_c88._2_2_,
                            CONCAT24(local_c78._2_2_,
                                     CONCAT22((undefined2)local_c88,(short)local_cc8)));
      uStack_12f0 = CONCAT26(local_c88._6_2_,
                             CONCAT24(local_c78._6_2_,CONCAT22(local_c88._4_2_,local_c78._4_2_)));
      local_c98._2_2_ = (undefined2)((ulong)local_ce8 >> 0x10);
      local_c98._4_2_ = (undefined2)((ulong)local_ce8 >> 0x20);
      local_c98._6_2_ = (undefined2)((ulong)local_ce8 >> 0x30);
      local_ca8._0_2_ = (undefined2)local_cf8;
      local_ca8._2_2_ = (undefined2)((ulong)local_cf8 >> 0x10);
      local_ca8._4_2_ = (undefined2)((ulong)local_cf8 >> 0x20);
      local_ca8._6_2_ = (undefined2)((ulong)local_cf8 >> 0x30);
      local_12e8 = CONCAT26(local_ca8._2_2_,
                            CONCAT24(local_c98._2_2_,
                                     CONCAT22((undefined2)local_ca8,(short)local_ce8)));
      uStack_12e0 = CONCAT26(local_ca8._6_2_,
                             CONCAT24(local_c98._6_2_,CONCAT22(local_ca8._4_2_,local_c98._4_2_)));
      uStack_9d0._2_2_ = (undefined2)((ulong)uStack_c50 >> 0x10);
      uStack_9d0._4_2_ = (undefined2)((ulong)uStack_c50 >> 0x20);
      uStack_9d0._6_2_ = (undefined2)((ulong)uStack_c50 >> 0x30);
      uStack_9e0._0_2_ = (undefined2)uStack_cb0;
      uStack_9e0._2_2_ = (undefined2)((ulong)uStack_cb0 >> 0x10);
      uStack_9e0._4_2_ = (undefined2)((ulong)uStack_cb0 >> 0x20);
      uStack_9e0._6_2_ = (undefined2)((ulong)uStack_cb0 >> 0x30);
      local_12c8 = CONCAT26(uStack_9e0._2_2_,
                            CONCAT24(uStack_9d0._2_2_,
                                     CONCAT22((undefined2)uStack_9e0,(short)uStack_c50)));
      uStack_12c0 = CONCAT26(uStack_9e0._6_2_,
                             CONCAT24(uStack_9d0._6_2_,CONCAT22(uStack_9e0._4_2_,uStack_9d0._4_2_)))
      ;
      uStack_9f0._2_2_ = (undefined2)((ulong)uStack_cc0 >> 0x10);
      uStack_9f0._4_2_ = (undefined2)((ulong)uStack_cc0 >> 0x20);
      uStack_9f0._6_2_ = (undefined2)((ulong)uStack_cc0 >> 0x30);
      uStack_a00._0_2_ = (undefined2)uStack_cd0;
      uStack_a00._2_2_ = (undefined2)((ulong)uStack_cd0 >> 0x10);
      uStack_a00._4_2_ = (undefined2)((ulong)uStack_cd0 >> 0x20);
      uStack_a00._6_2_ = (undefined2)((ulong)uStack_cd0 >> 0x30);
      local_12b8 = CONCAT26(uStack_a00._2_2_,
                            CONCAT24(uStack_9f0._2_2_,
                                     CONCAT22((undefined2)uStack_a00,(short)uStack_cc0)));
      uStack_12b0 = CONCAT26(uStack_a00._6_2_,
                             CONCAT24(uStack_9f0._6_2_,CONCAT22(uStack_a00._4_2_,uStack_9f0._4_2_)))
      ;
      uStack_a10._2_2_ = (undefined2)((ulong)uStack_ce0 >> 0x10);
      uStack_a10._4_2_ = (undefined2)((ulong)uStack_ce0 >> 0x20);
      uStack_a10._6_2_ = (undefined2)((ulong)uStack_ce0 >> 0x30);
      uStack_a20._0_2_ = (undefined2)uStack_cf0;
      uStack_a20._2_2_ = (undefined2)((ulong)uStack_cf0 >> 0x10);
      uStack_a20._4_2_ = (undefined2)((ulong)uStack_cf0 >> 0x20);
      uStack_a20._6_2_ = (undefined2)((ulong)uStack_cf0 >> 0x30);
      local_12a8 = CONCAT26(uStack_a20._2_2_,
                            CONCAT24(uStack_a10._2_2_,
                                     CONCAT22((undefined2)uStack_a20,(short)uStack_ce0)));
      uStack_12a0 = CONCAT26(uStack_a20._6_2_,
                             CONCAT24(uStack_a10._6_2_,CONCAT22(uStack_a20._4_2_,uStack_a10._4_2_)))
      ;
      local_1288 = CONCAT26(local_c78._2_2_,
                            CONCAT24(local_c68._2_2_,
                                     CONCAT22((short)local_cc8,(undefined2)local_c68)));
      uStack_1280 = CONCAT26(local_c78._6_2_,
                             CONCAT24(local_c68._6_2_,CONCAT22(local_c78._4_2_,local_c68._4_2_)));
      local_1278 = CONCAT26(local_c98._2_2_,
                            CONCAT24(local_c88._2_2_,
                                     CONCAT22((short)local_ce8,(undefined2)local_c88)));
      uStack_1270 = CONCAT26(local_c98._6_2_,
                             CONCAT24(local_c88._6_2_,CONCAT22(local_c98._4_2_,local_c88._4_2_)));
      local_d08._0_2_ = (undefined2)local_a88;
      local_d08._2_2_ = (undefined2)((ulong)local_a88 >> 0x10);
      local_d08._4_2_ = (undefined2)((ulong)local_a88 >> 0x20);
      local_d08._6_2_ = (undefined2)((ulong)local_a88 >> 0x30);
      local_1268 = CONCAT26(local_d08._2_2_,
                            CONCAT24(local_ca8._2_2_,
                                     CONCAT22((undefined2)local_d08,(undefined2)local_ca8)));
      uStack_1260 = CONCAT26(local_d08._6_2_,
                             CONCAT24(local_ca8._6_2_,CONCAT22(local_d08._4_2_,local_ca8._4_2_)));
      local_1248 = CONCAT26(uStack_9f0._2_2_,
                            CONCAT24(uStack_9e0._2_2_,
                                     CONCAT22((short)uStack_cc0,(undefined2)uStack_9e0)));
      uStack_1240 = CONCAT26(uStack_9f0._6_2_,
                             CONCAT24(uStack_9e0._6_2_,CONCAT22(uStack_9f0._4_2_,uStack_9e0._4_2_)))
      ;
      local_1238 = CONCAT26(uStack_a10._2_2_,
                            CONCAT24(uStack_a00._2_2_,
                                     CONCAT22((short)uStack_ce0,(undefined2)uStack_a00)));
      uStack_1230 = CONCAT26(uStack_a10._6_2_,
                             CONCAT24(uStack_a00._6_2_,CONCAT22(uStack_a10._4_2_,uStack_a00._4_2_)))
      ;
      uStack_a80._0_2_ = (undefined2)uStack_d00;
      uStack_a80._2_2_ = (undefined2)((ulong)uStack_d00 >> 0x10);
      uStack_a80._4_2_ = (undefined2)((ulong)uStack_d00 >> 0x20);
      uStack_a80._6_2_ = (undefined2)((ulong)uStack_d00 >> 0x30);
      local_1228 = CONCAT26(uStack_a80._2_2_,
                            CONCAT24(uStack_a20._2_2_,
                                     CONCAT22((undefined2)uStack_a80,(undefined2)uStack_a20)));
      uStack_1220 = CONCAT26(uStack_a80._6_2_,
                             CONCAT24(uStack_a20._6_2_,CONCAT22(uStack_a80._4_2_,uStack_a20._4_2_)))
      ;
      local_13c8 = local_a88;
      uStack_13c0 = uStack_d00;
      local_d08 = local_a88;
      local_ca8 = local_cf8;
      uStack_ca0 = uStack_cf0;
      local_c98 = local_ce8;
      uStack_c90 = uStack_ce0;
      local_c88 = local_cd8;
      uStack_c80 = uStack_cd0;
      local_c78 = local_cc8;
      uStack_c70 = uStack_cc0;
      local_c68 = local_cb8;
      uStack_c60 = uStack_cb0;
      local_c58 = local_9d8;
      uStack_a80 = uStack_d00;
      local_a78 = local_cf8;
      uStack_a70 = uStack_cf0;
      local_a68 = local_ce8;
      uStack_a60 = uStack_ce0;
      local_a58 = local_cd8;
      uStack_a50 = uStack_cd0;
      local_a48 = local_cc8;
      uStack_a40 = uStack_cc0;
      local_a38 = local_cb8;
      uStack_a30 = uStack_cb0;
      local_a28 = local_cf8;
      uStack_a20 = uStack_cf0;
      local_a18 = local_ce8;
      uStack_a10 = uStack_ce0;
      local_a08 = local_cd8;
      uStack_a00 = uStack_cd0;
      local_9f8 = local_cc8;
      uStack_9f0 = uStack_cc0;
      local_9e8 = local_cb8;
      uStack_9e0 = uStack_cb0;
      uStack_9d0 = uStack_c50;
      for (local_e50 = 0; local_e50 < local_e4c; local_e50 = local_e50 + 2) {
        lVar1 = local_e60 + (long)(local_e50 * local_e34 + local_e54) * 2;
        local_df0 = (undefined8 *)(lVar1 + (long)(local_e34 * 7) * 2);
        local_d38 = *local_df0;
        uStack_d30 = local_df0[1];
        local_df8 = (undefined8 *)(lVar1 + (long)(local_e34 << 3) * 2);
        uVar2 = *local_df8;
        uVar3 = local_df8[1];
        local_d18 = local_13c8;
        uVar28 = local_d18;
        uStack_d10 = uStack_13c0;
        local_d18._0_2_ = (undefined2)local_13c8;
        local_d18._2_2_ = (undefined2)((ulong)local_13c8 >> 0x10);
        local_d18._4_2_ = (undefined2)((ulong)local_13c8 >> 0x20);
        local_d18._6_2_ = (undefined2)((ulong)local_13c8 >> 0x30);
        local_d28._0_2_ = (undefined2)local_d38;
        local_d28._2_2_ = (undefined2)((ulong)local_d38 >> 0x10);
        local_d28._4_2_ = (undefined2)((ulong)local_d38 >> 0x20);
        local_d28._6_2_ = (undefined2)((ulong)local_d38 >> 0x30);
        local_12d8 = (undefined2)local_d18;
        uStack_12d6 = (undefined2)local_d28;
        uStack_12d4 = local_d18._2_2_;
        uStack_12d2 = local_d28._2_2_;
        uStack_12d0 = local_d18._4_2_;
        uStack_12ce = local_d28._4_2_;
        uStack_12cc = local_d18._6_2_;
        uStack_12ca = local_d28._6_2_;
        local_a98 = local_13c8;
        uStack_a90 = uStack_13c0;
        uVar29 = uStack_a90;
        uStack_a90._0_2_ = (undefined2)uStack_13c0;
        uStack_a90._2_2_ = (undefined2)((ulong)uStack_13c0 >> 0x10);
        uStack_a90._4_2_ = (undefined2)((ulong)uStack_13c0 >> 0x20);
        uStack_a90._6_2_ = (undefined2)((ulong)uStack_13c0 >> 0x30);
        uStack_aa0._0_2_ = (undefined2)uStack_d30;
        uStack_aa0._2_2_ = (undefined2)((ulong)uStack_d30 >> 0x10);
        uStack_aa0._4_2_ = (undefined2)((ulong)uStack_d30 >> 0x20);
        uStack_aa0._6_2_ = (undefined2)((ulong)uStack_d30 >> 0x30);
        local_1298 = (undefined2)uStack_a90;
        uStack_1296 = (undefined2)uStack_aa0;
        uStack_1294 = uStack_a90._2_2_;
        uStack_1292 = uStack_aa0._2_2_;
        uStack_1290 = uStack_a90._4_2_;
        uStack_128e = uStack_aa0._4_2_;
        uStack_128c = uStack_a90._6_2_;
        uStack_128a = uStack_aa0._6_2_;
        local_d48._0_2_ = (undefined2)uVar2;
        local_d48._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
        local_d48._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
        local_d48._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
        local_1258 = (undefined2)local_d28;
        uStack_1256 = (undefined2)local_d48;
        uStack_1254 = local_d28._2_2_;
        uStack_1252 = local_d48._2_2_;
        uStack_1250 = local_d28._4_2_;
        uStack_124e = local_d48._4_2_;
        uStack_124c = local_d28._6_2_;
        uStack_124a = local_d48._6_2_;
        uStack_ac0._0_2_ = (undefined2)uVar3;
        uStack_ac0._2_2_ = (undefined2)((ulong)uVar3 >> 0x10);
        uStack_ac0._4_2_ = (undefined2)((ulong)uVar3 >> 0x20);
        uStack_ac0._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
        local_1218 = (undefined2)uStack_aa0;
        uStack_1216 = (undefined2)uStack_ac0;
        uStack_1214 = uStack_aa0._2_2_;
        uStack_1212 = uStack_ac0._2_2_;
        uStack_1210 = uStack_aa0._4_2_;
        uStack_120e = uStack_ac0._4_2_;
        uStack_120c = uStack_aa0._6_2_;
        uStack_120a = uStack_ac0._6_2_;
        local_d48 = uVar2;
        uStack_d40 = uVar3;
        local_d28 = local_d38;
        uStack_d20 = uStack_d30;
        local_d18 = uVar28;
        local_ac8 = uVar2;
        uStack_ac0 = uVar3;
        local_ab8 = local_d38;
        uStack_ab0 = uStack_d30;
        local_aa8 = local_d38;
        uStack_aa0 = uStack_d30;
        uStack_a90 = uVar29;
        convolve((__m128i *)&local_1308,(__m128i *)local_1348);
        local_6e8 = local_e88;
        uVar28 = local_6e8;
        uStack_6e0 = uStack_e80;
        uVar29 = uStack_6e0;
        local_6d8 = (int)extraout_XMM0_Qa_03;
        iStack_6d4 = (int)((ulong)extraout_XMM0_Qa_03 >> 0x20);
        iStack_6d0 = (int)extraout_XMM0_Qb_03;
        iStack_6cc = (int)((ulong)extraout_XMM0_Qb_03 >> 0x20);
        local_6e8._0_4_ = (int)local_e88;
        local_6e8._4_4_ = (int)((ulong)local_e88 >> 0x20);
        uStack_6e0._0_4_ = (int)uStack_e80;
        uStack_6e0._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
        local_7d8 = local_6d8 + (int)local_6e8;
        iStack_7d4 = iStack_6d4 + local_6e8._4_4_;
        iStack_7d0 = iStack_6d0 + (int)uStack_6e0;
        iStack_7cc = iStack_6cc + uStack_6e0._4_4_;
        local_7e8 = local_e78;
        uStack_7e0 = uStack_e70;
        auVar55._8_8_ = uStack_e70;
        auVar55._0_8_ = local_e78;
        local_1408 = CONCAT44(iStack_7d4 >> auVar55,local_7d8 >> auVar55);
        uStack_1400._0_4_ = iStack_7d0 >> auVar55;
        uStack_1400._4_4_ = iStack_7cc >> auVar55;
        local_6e8 = uVar28;
        uStack_6e0 = uVar29;
        convolve((__m128i *)&local_1288,(__m128i *)local_1348);
        uVar43 = uStack_2e0;
        uVar42 = local_2e8;
        uVar38 = uStack_460;
        uVar33 = local_468;
        local_708 = local_e88;
        uVar28 = local_708;
        uStack_700 = uStack_e80;
        uVar29 = uStack_700;
        local_6f8 = (int)extraout_XMM0_Qa_04;
        iStack_6f4 = (int)((ulong)extraout_XMM0_Qa_04 >> 0x20);
        iStack_6f0 = (int)extraout_XMM0_Qb_04;
        iStack_6ec = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
        local_708._0_4_ = (int)local_e88;
        local_708._4_4_ = (int)((ulong)local_e88 >> 0x20);
        uStack_700._0_4_ = (int)uStack_e80;
        uStack_700._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
        local_7f8 = local_6f8 + (int)local_708;
        iStack_7f4 = iStack_6f4 + local_708._4_4_;
        iStack_7f0 = iStack_6f0 + (int)uStack_700;
        iStack_7ec = iStack_6ec + uStack_700._4_4_;
        local_808 = local_e78;
        uStack_800 = uStack_e70;
        auVar54._8_8_ = uStack_e70;
        auVar54._0_8_ = local_e78;
        local_1428 = CONCAT44(iStack_7f4 >> auVar54,local_7f8 >> auVar54);
        uStack_1420._0_4_ = iStack_7f0 >> auVar54;
        uStack_1420._4_4_ = iStack_7ec >> auVar54;
        local_708 = uVar28;
        uStack_700 = uVar29;
        if (local_e48 - local_e54 < 5) {
          local_468._0_2_ = (short)local_e98;
          sVar32 = (short)local_468;
          local_468._2_2_ = (short)((ulong)local_e98 >> 0x10);
          sVar34 = local_468._2_2_;
          local_468._4_2_ = (short)((ulong)local_e98 >> 0x20);
          sVar35 = local_468._4_2_;
          local_468._6_2_ = (short)((ulong)local_e98 >> 0x30);
          sVar36 = local_468._6_2_;
          uStack_460._0_2_ = (short)uStack_e90;
          sVar37 = (short)uStack_460;
          uStack_460._2_2_ = (short)((ulong)uStack_e90 >> 0x10);
          sVar39 = uStack_460._2_2_;
          uStack_460._4_2_ = (short)((ulong)uStack_e90 >> 0x20);
          sVar40 = uStack_460._4_2_;
          uStack_460._6_2_ = (short)((ulong)uStack_e90 >> 0x30);
          sVar41 = uStack_460._6_2_;
          local_2e8._0_2_ = (short)local_ea8;
          sVar44 = (short)local_2e8;
          local_2e8._2_2_ = (short)((ulong)local_ea8 >> 0x10);
          sVar45 = local_2e8._2_2_;
          local_2e8._4_2_ = (short)((ulong)local_ea8 >> 0x20);
          sVar46 = local_2e8._4_2_;
          local_2e8._6_2_ = (short)((ulong)local_ea8 >> 0x30);
          sVar47 = local_2e8._6_2_;
          uStack_2e0._0_2_ = (short)uStack_ea0;
          sVar48 = (short)uStack_2e0;
          uStack_2e0._2_2_ = (short)((ulong)uStack_ea0 >> 0x10);
          sVar49 = uStack_2e0._2_2_;
          uStack_2e0._4_2_ = (short)((ulong)uStack_ea0 >> 0x20);
          sVar50 = uStack_2e0._4_2_;
          uStack_2e0._6_2_ = (short)((ulong)uStack_ea0 >> 0x30);
          sVar51 = uStack_2e0._6_2_;
          if (local_e48 == 4) {
            local_5d8 = local_1408;
            uStack_5d0 = uStack_1400;
            local_5e8 = local_1408;
            uStack_5e0 = uStack_1400;
            auVar17._8_8_ = uStack_1400;
            auVar17._0_8_ = local_1408;
            auVar16._8_8_ = uStack_1400;
            auVar16._0_8_ = local_1408;
            auVar54 = packssdw(auVar17,auVar16);
            local_1408 = auVar54._0_8_;
            uStack_1400 = auVar54._8_8_;
            local_458 = local_1408;
            uVar33 = local_458;
            uStack_450 = uStack_1400;
            uVar38 = uStack_450;
            local_468 = local_e98;
            uStack_460 = uStack_e90;
            local_458._0_2_ = auVar54._0_2_;
            local_458._2_2_ = auVar54._2_2_;
            local_458._4_2_ = auVar54._4_2_;
            local_458._6_2_ = auVar54._6_2_;
            uStack_450._0_2_ = auVar54._8_2_;
            uStack_450._2_2_ = auVar54._10_2_;
            uStack_450._4_2_ = auVar54._12_2_;
            uStack_450._6_2_ = auVar54._14_2_;
            uVar52 = (ushort)(sVar32 < (short)local_458) * sVar32 |
                     (ushort)(sVar32 >= (short)local_458) * (short)local_458;
            uVar56 = (ushort)(sVar34 < local_458._2_2_) * sVar34 |
                     (ushort)(sVar34 >= local_458._2_2_) * local_458._2_2_;
            uVar57 = (ushort)(sVar35 < local_458._4_2_) * sVar35 |
                     (ushort)(sVar35 >= local_458._4_2_) * local_458._4_2_;
            uVar59 = (ushort)(sVar36 < local_458._6_2_) * sVar36 |
                     (ushort)(sVar36 >= local_458._6_2_) * local_458._6_2_;
            uVar60 = (ushort)(sVar37 < (short)uStack_450) * sVar37 |
                     (ushort)(sVar37 >= (short)uStack_450) * (short)uStack_450;
            uVar62 = (ushort)(sVar39 < uStack_450._2_2_) * sVar39 |
                     (ushort)(sVar39 >= uStack_450._2_2_) * uStack_450._2_2_;
            uVar63 = (ushort)(sVar40 < uStack_450._4_2_) * sVar40 |
                     (ushort)(sVar40 >= uStack_450._4_2_) * uStack_450._4_2_;
            uVar65 = (ushort)(sVar41 < uStack_450._6_2_) * sVar41 |
                     (ushort)(sVar41 >= uStack_450._6_2_) * uStack_450._6_2_;
            local_1408._0_4_ = CONCAT22(uVar56,uVar52);
            local_1408._0_6_ = CONCAT24(uVar57,(undefined4)local_1408);
            local_1408 = CONCAT26(uVar59,(undefined6)local_1408);
            uStack_1400._0_2_ = uVar60;
            uStack_1400._2_2_ = uVar62;
            uStack_1400._4_2_ = uVar63;
            uStack_1400._6_2_ = uVar65;
            local_2d8 = local_1408;
            uStack_2d0 = uStack_1400;
            local_2e8 = local_ea8;
            uStack_2e0 = uStack_ea0;
            local_1408._0_4_ =
                 CONCAT22((ushort)((short)uVar56 < sVar45) * sVar45 |
                          ((short)uVar56 >= sVar45) * uVar56,
                          (ushort)((short)uVar52 < sVar44) * sVar44 |
                          ((short)uVar52 >= sVar44) * uVar52);
            local_1408._0_6_ =
                 CONCAT24((ushort)((short)uVar57 < sVar46) * sVar46 |
                          ((short)uVar57 >= sVar46) * uVar57,(undefined4)local_1408);
            local_1408 = CONCAT26((ushort)((short)uVar59 < sVar47) * sVar47 |
                                  ((short)uVar59 >= sVar47) * uVar59,(undefined6)local_1408);
            uStack_1400._0_2_ =
                 (ushort)((short)uVar60 < sVar48) * sVar48 | ((short)uVar60 >= sVar48) * uVar60;
            uStack_1400._2_2_ =
                 (ushort)((short)uVar62 < sVar49) * sVar49 | ((short)uVar62 >= sVar49) * uVar62;
            uStack_1400._4_2_ =
                 (ushort)((short)uVar63 < sVar50) * sVar50 | ((short)uVar63 >= sVar50) * uVar63;
            uStack_1400._6_2_ =
                 (ushort)((short)uVar65 < sVar51) * sVar51 | ((short)uVar65 >= sVar51) * uVar65;
            local_5f8 = local_1428;
            uStack_5f0 = uStack_1420;
            local_608 = local_1428;
            uStack_600 = uStack_1420;
            auVar15._8_8_ = uStack_1420;
            auVar15._0_8_ = local_1428;
            auVar14._8_8_ = uStack_1420;
            auVar14._0_8_ = local_1428;
            auVar54 = packssdw(auVar15,auVar14);
            local_1428 = auVar54._0_8_;
            uStack_1420 = auVar54._8_8_;
            local_478 = local_1428;
            uVar28 = local_478;
            uStack_470 = uStack_1420;
            uVar29 = uStack_470;
            local_488 = local_e98;
            uStack_480 = uStack_e90;
            local_478._0_2_ = auVar54._0_2_;
            local_478._2_2_ = auVar54._2_2_;
            local_478._4_2_ = auVar54._4_2_;
            local_478._6_2_ = auVar54._6_2_;
            uStack_470._0_2_ = auVar54._8_2_;
            uStack_470._2_2_ = auVar54._10_2_;
            uStack_470._4_2_ = auVar54._12_2_;
            uStack_470._6_2_ = auVar54._14_2_;
            uVar52 = (ushort)(sVar32 < (short)local_478) * sVar32 |
                     (ushort)(sVar32 >= (short)local_478) * (short)local_478;
            uVar56 = (ushort)(sVar34 < local_478._2_2_) * sVar34 |
                     (ushort)(sVar34 >= local_478._2_2_) * local_478._2_2_;
            uVar57 = (ushort)(sVar35 < local_478._4_2_) * sVar35 |
                     (ushort)(sVar35 >= local_478._4_2_) * local_478._4_2_;
            uVar59 = (ushort)(sVar36 < local_478._6_2_) * sVar36 |
                     (ushort)(sVar36 >= local_478._6_2_) * local_478._6_2_;
            uVar60 = (ushort)(sVar37 < (short)uStack_470) * sVar37 |
                     (ushort)(sVar37 >= (short)uStack_470) * (short)uStack_470;
            uVar62 = (ushort)(sVar39 < uStack_470._2_2_) * sVar39 |
                     (ushort)(sVar39 >= uStack_470._2_2_) * uStack_470._2_2_;
            uVar63 = (ushort)(sVar40 < uStack_470._4_2_) * sVar40 |
                     (ushort)(sVar40 >= uStack_470._4_2_) * uStack_470._4_2_;
            uVar65 = (ushort)(sVar41 < uStack_470._6_2_) * sVar41 |
                     (ushort)(sVar41 >= uStack_470._6_2_) * uStack_470._6_2_;
            local_1428._0_4_ = CONCAT22(uVar56,uVar52);
            local_1428._0_6_ = CONCAT24(uVar57,(undefined4)local_1428);
            local_1428 = CONCAT26(uVar59,(undefined6)local_1428);
            uStack_1420._0_2_ = uVar60;
            uStack_1420._2_2_ = uVar62;
            uStack_1420._4_2_ = uVar63;
            uStack_1420._6_2_ = uVar65;
            local_2f8 = local_1428;
            uStack_2f0 = uStack_1420;
            local_308 = local_ea8;
            uStack_300 = uStack_ea0;
            local_1428._0_4_ =
                 CONCAT22((ushort)((short)uVar56 < sVar45) * sVar45 |
                          ((short)uVar56 >= sVar45) * uVar56,
                          (ushort)((short)uVar52 < sVar44) * sVar44 |
                          ((short)uVar52 >= sVar44) * uVar52);
            local_1428._0_6_ =
                 CONCAT24((ushort)((short)uVar57 < sVar46) * sVar46 |
                          ((short)uVar57 >= sVar46) * uVar57,(undefined4)local_1428);
            local_1428 = CONCAT26((ushort)((short)uVar59 < sVar47) * sVar47 |
                                  ((short)uVar59 >= sVar47) * uVar59,(undefined6)local_1428);
            uStack_1420._0_2_ =
                 (ushort)((short)uVar60 < sVar48) * sVar48 | ((short)uVar60 >= sVar48) * uVar60;
            uStack_1420._2_2_ =
                 (ushort)((short)uVar62 < sVar49) * sVar49 | ((short)uVar62 >= sVar49) * uVar62;
            uStack_1420._4_2_ =
                 (ushort)((short)uVar63 < sVar50) * sVar50 | ((short)uVar63 >= sVar50) * uVar63;
            uStack_1420._6_2_ =
                 (ushort)((short)uVar65 < sVar51) * sVar51 | ((short)uVar65 >= sVar51) * uVar65;
            local_110 = (undefined8 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54) * 2);
            local_128 = local_1408;
            uStack_120 = uStack_1400;
            *local_110 = local_1408;
            local_130 = (undefined8 *)
                        (local_e40 + (long)(local_e50 * local_e44 + local_e54 + local_e44) * 2);
            local_148 = local_1428;
            uStack_140 = uStack_1420;
            *local_130 = local_1428;
            local_478 = uVar28;
            uStack_470 = uVar29;
            local_458 = uVar33;
            uStack_450 = uVar38;
          }
          else {
            local_618 = local_1408;
            uStack_610 = uStack_1400;
            local_628 = local_1408;
            uStack_620 = uStack_1400;
            auVar13._8_8_ = uStack_1400;
            auVar13._0_8_ = local_1408;
            auVar12._8_8_ = uStack_1400;
            auVar12._0_8_ = local_1408;
            auVar54 = packssdw(auVar13,auVar12);
            local_1408 = auVar54._0_8_;
            uStack_1400 = auVar54._8_8_;
            local_498 = local_1408;
            uVar30 = local_498;
            uStack_490 = uStack_1400;
            uVar31 = uStack_490;
            local_4a8 = local_e98;
            uStack_4a0 = uStack_e90;
            local_498._0_2_ = auVar54._0_2_;
            local_498._2_2_ = auVar54._2_2_;
            local_498._4_2_ = auVar54._4_2_;
            local_498._6_2_ = auVar54._6_2_;
            uStack_490._0_2_ = auVar54._8_2_;
            uStack_490._2_2_ = auVar54._10_2_;
            uStack_490._4_2_ = auVar54._12_2_;
            uStack_490._6_2_ = auVar54._14_2_;
            uVar52 = (ushort)((short)local_468 < (short)local_498) * (short)local_468 |
                     (ushort)((short)local_468 >= (short)local_498) * (short)local_498;
            uVar56 = (ushort)(local_468._2_2_ < local_498._2_2_) * local_468._2_2_ |
                     (ushort)(local_468._2_2_ >= local_498._2_2_) * local_498._2_2_;
            uVar57 = (ushort)(local_468._4_2_ < local_498._4_2_) * local_468._4_2_ |
                     (ushort)(local_468._4_2_ >= local_498._4_2_) * local_498._4_2_;
            uVar59 = (ushort)(local_468._6_2_ < local_498._6_2_) * local_468._6_2_ |
                     (ushort)(local_468._6_2_ >= local_498._6_2_) * local_498._6_2_;
            uVar60 = (ushort)((short)uStack_460 < (short)uStack_490) * (short)uStack_460 |
                     (ushort)((short)uStack_460 >= (short)uStack_490) * (short)uStack_490;
            uVar62 = (ushort)(uStack_460._2_2_ < uStack_490._2_2_) * uStack_460._2_2_ |
                     (ushort)(uStack_460._2_2_ >= uStack_490._2_2_) * uStack_490._2_2_;
            uVar63 = (ushort)(uStack_460._4_2_ < uStack_490._4_2_) * uStack_460._4_2_ |
                     (ushort)(uStack_460._4_2_ >= uStack_490._4_2_) * uStack_490._4_2_;
            uVar65 = (ushort)(uStack_460._6_2_ < uStack_490._6_2_) * uStack_460._6_2_ |
                     (ushort)(uStack_460._6_2_ >= uStack_490._6_2_) * uStack_490._6_2_;
            local_1408._0_4_ = CONCAT22(uVar56,uVar52);
            local_1408._0_6_ = CONCAT24(uVar57,(undefined4)local_1408);
            local_1408 = CONCAT26(uVar59,(undefined6)local_1408);
            uStack_1400._0_2_ = uVar60;
            uStack_1400._2_2_ = uVar62;
            uStack_1400._4_2_ = uVar63;
            uStack_1400._6_2_ = uVar65;
            local_318 = local_1408;
            uStack_310 = uStack_1400;
            local_328 = local_ea8;
            uStack_320 = uStack_ea0;
            local_1408._0_4_ =
                 CONCAT22((ushort)((short)uVar56 < local_2e8._2_2_) * local_2e8._2_2_ |
                          ((short)uVar56 >= local_2e8._2_2_) * uVar56,
                          (ushort)((short)uVar52 < (short)local_2e8) * (short)local_2e8 |
                          ((short)uVar52 >= (short)local_2e8) * uVar52);
            local_1408._0_6_ =
                 CONCAT24((ushort)((short)uVar57 < local_2e8._4_2_) * local_2e8._4_2_ |
                          ((short)uVar57 >= local_2e8._4_2_) * uVar57,(undefined4)local_1408);
            local_1408 = CONCAT26((ushort)((short)uVar59 < local_2e8._6_2_) * local_2e8._6_2_ |
                                  ((short)uVar59 >= local_2e8._6_2_) * uVar59,(undefined6)local_1408
                                 );
            uStack_1400._0_2_ =
                 (ushort)((short)uVar60 < (short)uStack_2e0) * (short)uStack_2e0 |
                 ((short)uVar60 >= (short)uStack_2e0) * uVar60;
            uStack_1400._2_2_ =
                 (ushort)((short)uVar62 < uStack_2e0._2_2_) * uStack_2e0._2_2_ |
                 ((short)uVar62 >= uStack_2e0._2_2_) * uVar62;
            uStack_1400._4_2_ =
                 (ushort)((short)uVar63 < uStack_2e0._4_2_) * uStack_2e0._4_2_ |
                 ((short)uVar63 >= uStack_2e0._4_2_) * uVar63;
            uStack_1400._6_2_ =
                 (ushort)((short)uVar65 < uStack_2e0._6_2_) * uStack_2e0._6_2_ |
                 ((short)uVar65 >= uStack_2e0._6_2_) * uVar65;
            local_638 = local_1428;
            uStack_630 = uStack_1420;
            local_648 = local_1428;
            uStack_640 = uStack_1420;
            auVar11._8_8_ = uStack_1420;
            auVar11._0_8_ = local_1428;
            auVar10._8_8_ = uStack_1420;
            auVar10._0_8_ = local_1428;
            auVar54 = packssdw(auVar11,auVar10);
            local_1428 = auVar54._0_8_;
            uStack_1420 = auVar54._8_8_;
            local_4b8 = local_1428;
            uVar28 = local_4b8;
            uStack_4b0 = uStack_1420;
            uVar29 = uStack_4b0;
            local_4c8 = local_e98;
            uStack_4c0 = uStack_e90;
            local_4b8._0_2_ = auVar54._0_2_;
            local_4b8._2_2_ = auVar54._2_2_;
            local_4b8._4_2_ = auVar54._4_2_;
            local_4b8._6_2_ = auVar54._6_2_;
            uStack_4b0._0_2_ = auVar54._8_2_;
            uStack_4b0._2_2_ = auVar54._10_2_;
            uStack_4b0._4_2_ = auVar54._12_2_;
            uStack_4b0._6_2_ = auVar54._14_2_;
            uVar52 = (ushort)((short)local_468 < (short)local_4b8) * (short)local_468 |
                     (ushort)((short)local_468 >= (short)local_4b8) * (short)local_4b8;
            uVar56 = (ushort)(local_468._2_2_ < local_4b8._2_2_) * local_468._2_2_ |
                     (ushort)(local_468._2_2_ >= local_4b8._2_2_) * local_4b8._2_2_;
            uVar57 = (ushort)(local_468._4_2_ < local_4b8._4_2_) * local_468._4_2_ |
                     (ushort)(local_468._4_2_ >= local_4b8._4_2_) * local_4b8._4_2_;
            uVar59 = (ushort)(local_468._6_2_ < local_4b8._6_2_) * local_468._6_2_ |
                     (ushort)(local_468._6_2_ >= local_4b8._6_2_) * local_4b8._6_2_;
            uVar60 = (ushort)((short)uStack_460 < (short)uStack_4b0) * (short)uStack_460 |
                     (ushort)((short)uStack_460 >= (short)uStack_4b0) * (short)uStack_4b0;
            uVar62 = (ushort)(uStack_460._2_2_ < uStack_4b0._2_2_) * uStack_460._2_2_ |
                     (ushort)(uStack_460._2_2_ >= uStack_4b0._2_2_) * uStack_4b0._2_2_;
            uVar63 = (ushort)(uStack_460._4_2_ < uStack_4b0._4_2_) * uStack_460._4_2_ |
                     (ushort)(uStack_460._4_2_ >= uStack_4b0._4_2_) * uStack_4b0._4_2_;
            uVar65 = (ushort)(uStack_460._6_2_ < uStack_4b0._6_2_) * uStack_460._6_2_ |
                     (ushort)(uStack_460._6_2_ >= uStack_4b0._6_2_) * uStack_4b0._6_2_;
            local_1428._0_4_ = CONCAT22(uVar56,uVar52);
            local_1428._0_6_ = CONCAT24(uVar57,(undefined4)local_1428);
            local_1428 = CONCAT26(uVar59,(undefined6)local_1428);
            uStack_1420._0_2_ = uVar60;
            uStack_1420._2_2_ = uVar62;
            uStack_1420._4_2_ = uVar63;
            uStack_1420._6_2_ = uVar65;
            local_338 = local_1428;
            uStack_330 = uStack_1420;
            local_348 = local_ea8;
            uStack_340 = uStack_ea0;
            local_1428._0_4_ =
                 CONCAT22((ushort)((short)uVar56 < local_2e8._2_2_) * local_2e8._2_2_ |
                          ((short)uVar56 >= local_2e8._2_2_) * uVar56,
                          (ushort)((short)uVar52 < (short)local_2e8) * (short)local_2e8 |
                          ((short)uVar52 >= (short)local_2e8) * uVar52);
            local_1428._0_6_ =
                 CONCAT24((ushort)((short)uVar57 < local_2e8._4_2_) * local_2e8._4_2_ |
                          ((short)uVar57 >= local_2e8._4_2_) * uVar57,(undefined4)local_1428);
            local_1428 = CONCAT26((ushort)((short)uVar59 < local_2e8._6_2_) * local_2e8._6_2_ |
                                  ((short)uVar59 >= local_2e8._6_2_) * uVar59,(undefined6)local_1428
                                 );
            uStack_1420._0_2_ =
                 (ushort)((short)uVar60 < (short)uStack_2e0) * (short)uStack_2e0 |
                 ((short)uVar60 >= (short)uStack_2e0) * uVar60;
            uStack_1420._2_2_ =
                 (ushort)((short)uVar62 < uStack_2e0._2_2_) * uStack_2e0._2_2_ |
                 ((short)uVar62 >= uStack_2e0._2_2_) * uVar62;
            uStack_1420._4_2_ =
                 (ushort)((short)uVar63 < uStack_2e0._4_2_) * uStack_2e0._4_2_ |
                 ((short)uVar63 >= uStack_2e0._4_2_) * uVar63;
            uStack_1420._6_2_ =
                 (ushort)((short)uVar65 < uStack_2e0._6_2_) * uStack_2e0._6_2_ |
                 ((short)uVar65 >= uStack_2e0._6_2_) * uVar65;
            local_98 = local_1408;
            uStack_90 = uStack_1400;
            local_a8 = local_1408;
            uStack_a0 = uStack_1400;
            *(undefined4 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54) * 2) =
                 (undefined4)local_1408;
            local_b8 = local_1428;
            uStack_b0 = uStack_1420;
            local_c8 = local_1428;
            uStack_c0 = uStack_1420;
            *(undefined4 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54 + local_e44) * 2) =
                 (undefined4)local_1428;
            local_4b8 = uVar28;
            uStack_4b0 = uVar29;
            local_498 = uVar30;
            uStack_490 = uVar31;
            local_468 = uVar33;
            uStack_460 = uVar38;
            local_2e8 = uVar42;
            uStack_2e0 = uVar43;
          }
        }
        else {
          convolve((__m128i *)&local_12c8,(__m128i *)local_1348);
          local_728 = local_e88;
          uVar28 = local_728;
          uStack_720 = uStack_e80;
          uVar29 = uStack_720;
          local_718 = (int)extraout_XMM0_Qa_05;
          iStack_714 = (int)((ulong)extraout_XMM0_Qa_05 >> 0x20);
          iStack_710 = (int)extraout_XMM0_Qb_05;
          iStack_70c = (int)((ulong)extraout_XMM0_Qb_05 >> 0x20);
          local_728._0_4_ = (int)local_e88;
          local_728._4_4_ = (int)((ulong)local_e88 >> 0x20);
          uStack_720._0_4_ = (int)uStack_e80;
          uStack_720._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
          local_818 = local_718 + (int)local_728;
          iStack_814 = iStack_714 + local_728._4_4_;
          iStack_810 = iStack_710 + (int)uStack_720;
          iStack_80c = iStack_70c + uStack_720._4_4_;
          local_828 = local_e78;
          uStack_820 = uStack_e70;
          auVar5._8_8_ = uStack_e70;
          auVar5._0_8_ = local_e78;
          iVar53 = local_818 >> auVar5;
          iVar58 = iStack_814 >> auVar5;
          iVar61 = iStack_810 >> auVar5;
          iVar64 = iStack_80c >> auVar5;
          local_728 = uVar28;
          uStack_720 = uVar29;
          convolve((__m128i *)&local_1248,(__m128i *)local_1348);
          local_748 = local_e88;
          uVar28 = local_748;
          uStack_740 = uStack_e80;
          uVar29 = uStack_740;
          local_738 = (int)extraout_XMM0_Qa_06;
          iStack_734 = (int)((ulong)extraout_XMM0_Qa_06 >> 0x20);
          iStack_730 = (int)extraout_XMM0_Qb_06;
          iStack_72c = (int)((ulong)extraout_XMM0_Qb_06 >> 0x20);
          local_748._0_4_ = (int)local_e88;
          local_748._4_4_ = (int)((ulong)local_e88 >> 0x20);
          uStack_740._0_4_ = (int)uStack_e80;
          uStack_740._4_4_ = (int)((ulong)uStack_e80 >> 0x20);
          local_838 = local_738 + (int)local_748;
          iStack_834 = iStack_734 + local_748._4_4_;
          iStack_830 = iStack_730 + (int)uStack_740;
          iStack_82c = iStack_72c + uStack_740._4_4_;
          local_848 = local_e78;
          uStack_840 = uStack_e70;
          auVar4._8_8_ = uStack_e70;
          auVar4._0_8_ = local_e78;
          local_5a8 = CONCAT44(iVar58,iVar53);
          uStack_5a0 = CONCAT44(iVar64,iVar61);
          local_598 = local_1408;
          uStack_590 = uStack_1400;
          auVar21._8_8_ = uStack_1400;
          auVar21._0_8_ = local_1408;
          auVar20._8_8_ = uStack_5a0;
          auVar20._0_8_ = local_5a8;
          auVar54 = packssdw(auVar21,auVar20);
          local_428 = local_e98;
          uVar33 = local_428;
          uStack_420 = uStack_e90;
          uVar38 = uStack_420;
          local_418._0_2_ = auVar54._0_2_;
          local_418._2_2_ = auVar54._2_2_;
          local_418._4_2_ = auVar54._4_2_;
          local_418._6_2_ = auVar54._6_2_;
          uStack_410._0_2_ = auVar54._8_2_;
          uStack_410._2_2_ = auVar54._10_2_;
          uStack_410._4_2_ = auVar54._12_2_;
          uStack_410._6_2_ = auVar54._14_2_;
          local_428._0_2_ = (short)local_e98;
          local_428._2_2_ = (short)((ulong)local_e98 >> 0x10);
          local_428._4_2_ = (short)((ulong)local_e98 >> 0x20);
          local_428._6_2_ = (short)((ulong)local_e98 >> 0x30);
          uStack_420._0_2_ = (short)uStack_e90;
          uStack_420._2_2_ = (short)((ulong)uStack_e90 >> 0x10);
          uStack_420._4_2_ = (short)((ulong)uStack_e90 >> 0x20);
          uStack_420._6_2_ = (short)((ulong)uStack_e90 >> 0x30);
          uVar52 = (ushort)((short)local_428 < (short)local_418) * (short)local_428 |
                   (ushort)((short)local_428 >= (short)local_418) * (short)local_418;
          uVar56 = (ushort)(local_428._2_2_ < local_418._2_2_) * local_428._2_2_ |
                   (ushort)(local_428._2_2_ >= local_418._2_2_) * local_418._2_2_;
          uVar57 = (ushort)(local_428._4_2_ < local_418._4_2_) * local_428._4_2_ |
                   (ushort)(local_428._4_2_ >= local_418._4_2_) * local_418._4_2_;
          uVar59 = (ushort)(local_428._6_2_ < local_418._6_2_) * local_428._6_2_ |
                   (ushort)(local_428._6_2_ >= local_418._6_2_) * local_418._6_2_;
          uVar60 = (ushort)((short)uStack_420 < (short)uStack_410) * (short)uStack_420 |
                   (ushort)((short)uStack_420 >= (short)uStack_410) * (short)uStack_410;
          uVar62 = (ushort)(uStack_420._2_2_ < uStack_410._2_2_) * uStack_420._2_2_ |
                   (ushort)(uStack_420._2_2_ >= uStack_410._2_2_) * uStack_410._2_2_;
          uVar63 = (ushort)(uStack_420._4_2_ < uStack_410._4_2_) * uStack_420._4_2_ |
                   (ushort)(uStack_420._4_2_ >= uStack_410._4_2_) * uStack_410._4_2_;
          uVar65 = (ushort)(uStack_420._6_2_ < uStack_410._6_2_) * uStack_420._6_2_ |
                   (ushort)(uStack_420._6_2_ >= uStack_410._6_2_) * uStack_410._6_2_;
          auVar68._0_8_ = CONCAT26(uVar59,CONCAT24(uVar57,CONCAT22(uVar56,uVar52)));
          auVar68._8_2_ = uVar60;
          auVar68._10_2_ = uVar62;
          auVar68._12_2_ = uVar63;
          auVar68._14_2_ = uVar65;
          uStack_290 = auVar68._8_8_;
          local_2a8 = local_ea8;
          uVar42 = local_2a8;
          uStack_2a0 = uStack_ea0;
          uVar43 = uStack_2a0;
          local_2a8._0_2_ = (short)local_ea8;
          local_2a8._2_2_ = (short)((ulong)local_ea8 >> 0x10);
          local_2a8._4_2_ = (short)((ulong)local_ea8 >> 0x20);
          local_2a8._6_2_ = (short)((ulong)local_ea8 >> 0x30);
          uStack_2a0._0_2_ = (short)uStack_ea0;
          uStack_2a0._2_2_ = (short)((ulong)uStack_ea0 >> 0x10);
          uStack_2a0._4_2_ = (short)((ulong)uStack_ea0 >> 0x20);
          uStack_2a0._6_2_ = (short)((ulong)uStack_ea0 >> 0x30);
          auVar69._0_8_ =
               CONCAT26((ushort)((short)uVar59 < local_2a8._6_2_) * local_2a8._6_2_ |
                        ((short)uVar59 >= local_2a8._6_2_) * uVar59,
                        CONCAT24((ushort)((short)uVar57 < local_2a8._4_2_) * local_2a8._4_2_ |
                                 ((short)uVar57 >= local_2a8._4_2_) * uVar57,
                                 CONCAT22((ushort)((short)uVar56 < local_2a8._2_2_) *
                                          local_2a8._2_2_ |
                                          ((short)uVar56 >= local_2a8._2_2_) * uVar56,
                                          (ushort)((short)uVar52 < (short)local_2a8) *
                                          (short)local_2a8 |
                                          ((short)uVar52 >= (short)local_2a8) * uVar52)));
          auVar69._8_2_ =
               (ushort)((short)uVar60 < (short)uStack_2a0) * (short)uStack_2a0 |
               ((short)uVar60 >= (short)uStack_2a0) * uVar60;
          auVar69._10_2_ =
               (ushort)((short)uVar62 < uStack_2a0._2_2_) * uStack_2a0._2_2_ |
               ((short)uVar62 >= uStack_2a0._2_2_) * uVar62;
          auVar69._12_2_ =
               (ushort)((short)uVar63 < uStack_2a0._4_2_) * uStack_2a0._4_2_ |
               ((short)uVar63 >= uStack_2a0._4_2_) * uVar63;
          auVar69._14_2_ =
               (ushort)((short)uVar65 < uStack_2a0._6_2_) * uStack_2a0._6_2_ |
               ((short)uVar65 >= uStack_2a0._6_2_) * uVar65;
          local_5c8 = CONCAT44(iStack_834 >> auVar4,local_838 >> auVar4);
          uStack_5c0 = CONCAT44(iStack_82c >> auVar4,iStack_830 >> auVar4);
          local_5b8 = local_1428;
          uStack_5b0 = uStack_1420;
          auVar19._8_8_ = uStack_1420;
          auVar19._0_8_ = local_1428;
          auVar18._8_8_ = uStack_5c0;
          auVar18._0_8_ = local_5c8;
          auVar55 = packssdw(auVar19,auVar18);
          local_448 = local_e98;
          uStack_440 = uStack_e90;
          local_438._0_2_ = auVar55._0_2_;
          local_438._2_2_ = auVar55._2_2_;
          local_438._4_2_ = auVar55._4_2_;
          local_438._6_2_ = auVar55._6_2_;
          uStack_430._0_2_ = auVar55._8_2_;
          uStack_430._2_2_ = auVar55._10_2_;
          uStack_430._4_2_ = auVar55._12_2_;
          uStack_430._6_2_ = auVar55._14_2_;
          uVar52 = (ushort)((short)local_428 < (short)local_438) * (short)local_428 |
                   (ushort)((short)local_428 >= (short)local_438) * (short)local_438;
          uVar56 = (ushort)(local_428._2_2_ < local_438._2_2_) * local_428._2_2_ |
                   (ushort)(local_428._2_2_ >= local_438._2_2_) * local_438._2_2_;
          uVar57 = (ushort)(local_428._4_2_ < local_438._4_2_) * local_428._4_2_ |
                   (ushort)(local_428._4_2_ >= local_438._4_2_) * local_438._4_2_;
          uVar59 = (ushort)(local_428._6_2_ < local_438._6_2_) * local_428._6_2_ |
                   (ushort)(local_428._6_2_ >= local_438._6_2_) * local_438._6_2_;
          uVar60 = (ushort)((short)uStack_420 < (short)uStack_430) * (short)uStack_420 |
                   (ushort)((short)uStack_420 >= (short)uStack_430) * (short)uStack_430;
          uVar62 = (ushort)(uStack_420._2_2_ < uStack_430._2_2_) * uStack_420._2_2_ |
                   (ushort)(uStack_420._2_2_ >= uStack_430._2_2_) * uStack_430._2_2_;
          uVar63 = (ushort)(uStack_420._4_2_ < uStack_430._4_2_) * uStack_420._4_2_ |
                   (ushort)(uStack_420._4_2_ >= uStack_430._4_2_) * uStack_430._4_2_;
          uVar65 = (ushort)(uStack_420._6_2_ < uStack_430._6_2_) * uStack_420._6_2_ |
                   (ushort)(uStack_420._6_2_ >= uStack_430._6_2_) * uStack_430._6_2_;
          auVar66._0_8_ = CONCAT26(uVar59,CONCAT24(uVar57,CONCAT22(uVar56,uVar52)));
          auVar66._8_2_ = uVar60;
          auVar66._10_2_ = uVar62;
          auVar66._12_2_ = uVar63;
          auVar66._14_2_ = uVar65;
          uStack_2b0 = auVar66._8_8_;
          local_2c8 = local_ea8;
          uStack_2c0 = uStack_ea0;
          auVar67._0_8_ =
               CONCAT26((ushort)((short)uVar59 < local_2a8._6_2_) * local_2a8._6_2_ |
                        ((short)uVar59 >= local_2a8._6_2_) * uVar59,
                        CONCAT24((ushort)((short)uVar57 < local_2a8._4_2_) * local_2a8._4_2_ |
                                 ((short)uVar57 >= local_2a8._4_2_) * uVar57,
                                 CONCAT22((ushort)((short)uVar56 < local_2a8._2_2_) *
                                          local_2a8._2_2_ |
                                          ((short)uVar56 >= local_2a8._2_2_) * uVar56,
                                          (ushort)((short)uVar52 < (short)local_2a8) *
                                          (short)local_2a8 |
                                          ((short)uVar52 >= (short)local_2a8) * uVar52)));
          auVar67._8_2_ =
               (ushort)((short)uVar60 < (short)uStack_2a0) * (short)uStack_2a0 |
               ((short)uVar60 >= (short)uStack_2a0) * uVar60;
          auVar67._10_2_ =
               (ushort)((short)uVar62 < uStack_2a0._2_2_) * uStack_2a0._2_2_ |
               ((short)uVar62 >= uStack_2a0._2_2_) * uVar62;
          auVar67._12_2_ =
               (ushort)((short)uVar63 < uStack_2a0._4_2_) * uStack_2a0._4_2_ |
               ((short)uVar63 >= uStack_2a0._4_2_) * uVar63;
          auVar67._14_2_ =
               (ushort)((short)uVar65 < uStack_2a0._6_2_) * uStack_2a0._6_2_ |
               ((short)uVar65 >= uStack_2a0._6_2_) * uVar65;
          local_190 = (undefined8 *)(local_e40 + (long)(local_e50 * local_e44 + local_e54) * 2);
          uStack_1a0 = auVar69._8_8_;
          *local_190 = auVar69._0_8_;
          local_190[1] = uStack_1a0;
          local_1b0 = (undefined8 *)
                      (local_e40 + (long)(local_e50 * local_e44 + local_e54 + local_e44) * 2);
          uStack_1c0 = auVar67._8_8_;
          *local_1b0 = auVar67._0_8_;
          local_1b0[1] = uStack_1c0;
          local_748 = uVar28;
          uStack_740 = uVar29;
          local_438 = auVar55._0_8_;
          uStack_430 = auVar55._8_8_;
          local_428 = uVar33;
          uStack_420 = uVar38;
          local_418 = auVar54._0_8_;
          uStack_410 = auVar54._8_8_;
          local_2b8 = auVar66._0_8_;
          local_2a8 = uVar42;
          uStack_2a0 = uVar43;
          local_298 = auVar68._0_8_;
          local_1c8 = auVar67._0_8_;
          local_1a8 = auVar69._0_8_;
        }
        local_1308 = local_12f8;
        uStack_1300 = uStack_12f0;
        local_12f8 = local_12e8;
        uStack_12f0 = uStack_12e0;
        local_12e8 = CONCAT26(uStack_12d2,CONCAT24(uStack_12d4,CONCAT22(uStack_12d6,local_12d8)));
        uStack_12e0 = CONCAT26(uStack_12ca,CONCAT24(uStack_12cc,CONCAT22(uStack_12ce,uStack_12d0)));
        local_12c8 = local_12b8;
        uStack_12c0 = uStack_12b0;
        local_12b8 = local_12a8;
        uStack_12b0 = uStack_12a0;
        local_12a8 = CONCAT26(uStack_1292,CONCAT24(uStack_1294,CONCAT22(uStack_1296,local_1298)));
        uStack_12a0 = CONCAT26(uStack_128a,CONCAT24(uStack_128c,CONCAT22(uStack_128e,uStack_1290)));
        local_1288 = local_1278;
        uStack_1280 = uStack_1270;
        local_1278 = local_1268;
        uStack_1270 = uStack_1260;
        local_1268 = CONCAT26(uStack_1252,CONCAT24(uStack_1254,CONCAT22(uStack_1256,local_1258)));
        uStack_1260 = CONCAT26(uStack_124a,CONCAT24(uStack_124c,CONCAT22(uStack_124e,uStack_1250)));
        local_1248 = local_1238;
        uStack_1240 = uStack_1230;
        local_1238 = local_1228;
        uStack_1230 = uStack_1220;
        local_1228 = CONCAT26(uStack_1212,CONCAT24(uStack_1214,CONCAT22(uStack_1216,local_1218)));
        uStack_1220 = CONCAT26(uStack_120a,CONCAT24(uStack_120c,CONCAT22(uStack_120e,uStack_1210)));
        local_13c8 = uVar2;
        uStack_13c0 = uVar3;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_y_qn, int bd) {
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  if (filter_params_y->taps == 12) {
    __m128i s[24], coeffs_y[6];

    prepare_coeffs_12tap(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));
      __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
      __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));
      __m128i s9 = _mm_loadu_si128((__m128i *)(data + 9 * src_stride));
      __m128i s10 = _mm_loadu_si128((__m128i *)(data + 10 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);
      s[3] = _mm_unpacklo_epi16(s6, s7);
      s[4] = _mm_unpacklo_epi16(s8, s9);

      s[6] = _mm_unpackhi_epi16(s0, s1);
      s[7] = _mm_unpackhi_epi16(s2, s3);
      s[8] = _mm_unpackhi_epi16(s4, s5);
      s[9] = _mm_unpackhi_epi16(s6, s7);
      s[10] = _mm_unpackhi_epi16(s8, s9);

      s[12] = _mm_unpacklo_epi16(s1, s2);
      s[13] = _mm_unpacklo_epi16(s3, s4);
      s[14] = _mm_unpacklo_epi16(s5, s6);
      s[15] = _mm_unpacklo_epi16(s7, s8);
      s[16] = _mm_unpacklo_epi16(s9, s10);

      s[18] = _mm_unpackhi_epi16(s1, s2);
      s[19] = _mm_unpackhi_epi16(s3, s4);
      s[20] = _mm_unpackhi_epi16(s5, s6);
      s[21] = _mm_unpackhi_epi16(s7, s8);
      s[22] = _mm_unpackhi_epi16(s9, s10);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s11 = _mm_loadu_si128((__m128i *)(data + 11 * src_stride));
        __m128i s12 = _mm_loadu_si128((__m128i *)(data + 12 * src_stride));

        s[5] = _mm_unpacklo_epi16(s10, s11);
        s[11] = _mm_unpackhi_epi16(s10, s11);

        s[17] = _mm_unpacklo_epi16(s11, s12);
        s[23] = _mm_unpackhi_epi16(s11, s12);

        const __m128i res_a0 = convolve_12tap(s, coeffs_y);
        __m128i res_a_round0 = _mm_sra_epi32(
            _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

        const __m128i res_a1 = convolve_12tap(s + 12, coeffs_y);
        __m128i res_a_round1 = _mm_sra_epi32(
            _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m128i res_b0 = convolve_12tap(s + 6, coeffs_y);
          __m128i res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

          const __m128i res_b1 = convolve_12tap(s + 18, coeffs_y);
          __m128i res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

          __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
          res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
          res_16bit0 = _mm_max_epi16(res_16bit0, zero);

          __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
          res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
          res_16bit1 = _mm_max_epi16(res_16bit1, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_16bit1);
        } else if (w == 4) {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_a_round1);
        } else {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          *((int *)(&dst[i * dst_stride + j])) =
              _mm_cvtsi128_si32(res_a_round0);

          *((int *)(&dst[i * dst_stride + j + dst_stride])) =
              _mm_cvtsi128_si32(res_a_round1);
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];
        s[3] = s[4];
        s[4] = s[5];

        s[6] = s[7];
        s[7] = s[8];
        s[8] = s[9];
        s[9] = s[10];
        s[10] = s[11];

        s[12] = s[13];
        s[13] = s[14];
        s[14] = s[15];
        s[15] = s[16];
        s[16] = s[17];

        s[18] = s[19];
        s[19] = s[20];
        s[20] = s[21];
        s[21] = s[22];
        s[22] = s[23];

        s10 = s12;
      }
    }
  } else {
    __m128i s[16], coeffs_y[4];

    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      {
        __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
        __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
        __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
        __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
        __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
        __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
        __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

        s[0] = _mm_unpacklo_epi16(s0, s1);
        s[1] = _mm_unpacklo_epi16(s2, s3);
        s[2] = _mm_unpacklo_epi16(s4, s5);

        s[4] = _mm_unpackhi_epi16(s0, s1);
        s[5] = _mm_unpackhi_epi16(s2, s3);
        s[6] = _mm_unpackhi_epi16(s4, s5);

        s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
        s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
        s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

        s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
        s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
        s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

        for (i = 0; i < h; i += 2) {
          data = &src_ptr[i * src_stride + j];

          __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
          __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

          s[3] = _mm_unpacklo_epi16(s6, s7);
          s[7] = _mm_unpackhi_epi16(s6, s7);

          s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
          s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

          const __m128i res_a0 = convolve(s, coeffs_y);
          __m128i res_a_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

          const __m128i res_a1 = convolve(s + 8, coeffs_y);
          __m128i res_a_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

          if (w - j > 4) {
            const __m128i res_b0 = convolve(s + 4, coeffs_y);
            __m128i res_b_round0 = _mm_sra_epi32(
                _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

            const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
            __m128i res_b_round1 = _mm_sra_epi32(
                _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

            __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
            res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
            res_16bit0 = _mm_max_epi16(res_16bit0, zero);

            __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
            res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
            res_16bit1 = _mm_max_epi16(res_16bit1, zero);

            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16bit1);
          } else if (w == 4) {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_a_round1);
          } else {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            *((int *)(&dst[i * dst_stride + j])) =
                _mm_cvtsi128_si32(res_a_round0);

            *((int *)(&dst[i * dst_stride + j + dst_stride])) =
                _mm_cvtsi128_si32(res_a_round1);
          }

          s[0] = s[1];
          s[1] = s[2];
          s[2] = s[3];

          s[4] = s[5];
          s[5] = s[6];
          s[6] = s[7];

          s[0 + 8] = s[1 + 8];
          s[1 + 8] = s[2 + 8];
          s[2 + 8] = s[3 + 8];

          s[4 + 8] = s[5 + 8];
          s[5 + 8] = s[6 + 8];
          s[6 + 8] = s[7 + 8];

          s6 = s8;
        }
      }
    }
  }
}